

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  ulong uVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  ulong uVar86;
  long lVar87;
  long lVar88;
  undefined4 uVar89;
  undefined8 unaff_R13;
  bool bVar90;
  float fVar91;
  float fVar110;
  float fVar111;
  __m128 a;
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar112;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar93 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar138;
  float fVar139;
  vint4 ai;
  undefined1 auVar117 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar141;
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar145;
  float fVar148;
  float fVar151;
  undefined1 auVar126 [32];
  float fVar142;
  undefined1 auVar127 [32];
  float fVar140;
  float fVar143;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar152;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vint4 bi_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar161 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [28];
  float fVar218;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar216;
  float fVar217;
  undefined1 auVar215 [64];
  float fVar219;
  float fVar220;
  float fVar236;
  float fVar238;
  vint4 ai_1;
  undefined1 auVar221 [16];
  float fVar240;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [28];
  float fVar237;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar245;
  float fVar254;
  float fVar257;
  vint4 bi_1;
  undefined1 auVar248 [16];
  float fVar260;
  undefined1 auVar249 [16];
  float fVar246;
  float fVar247;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar255;
  float fVar258;
  float fVar261;
  float fVar263;
  float fVar265;
  float fVar267;
  undefined1 auVar252 [28];
  float fVar256;
  float fVar259;
  float fVar262;
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar253 [32];
  vint4 ai_2;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [28];
  float fVar280;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float fVar281;
  float fVar292;
  float fVar293;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar284 [16];
  float fVar294;
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  float s;
  float fVar295;
  float fVar296;
  float fVar304;
  float fVar306;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [28];
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar317;
  float fVar325;
  float fVar326;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar327;
  float fVar331;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar324 [64];
  float fVar332;
  float fVar336;
  float fVar337;
  undefined1 auVar333 [16];
  float fVar338;
  undefined1 auVar334 [16];
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar335 [32];
  float fVar343;
  float fVar344;
  float fVar349;
  float fVar351;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar358;
  float fVar360;
  undefined1 auVar347 [32];
  float fVar355;
  float fVar357;
  float fVar359;
  undefined1 auVar348 [64];
  float fVar361;
  float fVar367;
  float fVar368;
  undefined1 auVar362 [16];
  float fVar369;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar366 [64];
  undefined1 auVar373 [32];
  float fVar374;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar375 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_aec;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  RTCFilterFunctionNArguments local_a18;
  int local_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [32];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined1 local_900 [32];
  undefined8 local_8d0;
  float local_8c8;
  float local_8c4;
  undefined4 local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  Primitive *local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar11 = prim[1];
  uVar81 = (ulong)(byte)PVar11;
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xf + 6)));
  lVar87 = uVar81 * 0x25;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x11 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1a + 6)));
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1b + 6)));
  fVar245 = *(float *)(prim + lVar87 + 0x12);
  auVar158 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar87 + 6));
  auVar345._0_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar345._4_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar345._8_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar345._12_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar197._0_4_ = auVar158._0_4_ * fVar245;
  auVar197._4_4_ = auVar158._4_4_ * fVar245;
  auVar197._8_4_ = auVar158._8_4_ * fVar245;
  auVar197._12_4_ = auVar158._12_4_ * fVar245;
  auVar158 = vcvtdq2ps_avx(auVar181);
  auVar17 = vcvtdq2ps_avx(auVar178);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1c + 6)));
  auVar178 = vshufps_avx(auVar345,auVar345,0x55);
  auVar251 = vshufps_avx(auVar345,auVar345,0xaa);
  fVar245 = auVar251._0_4_;
  fVar254 = auVar251._4_4_;
  fVar257 = auVar251._8_4_;
  fVar260 = auVar251._12_4_;
  fVar142 = auVar178._0_4_;
  fVar145 = auVar178._4_4_;
  fVar148 = auVar178._8_4_;
  fVar195 = auVar178._12_4_;
  auVar251 = vcvtdq2ps_avx(auVar100);
  auVar18 = vcvtdq2ps_avx(auVar95);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar113 = vcvtdq2ps_avx(auVar181);
  auVar100 = vshufps_avx(auVar345,auVar345,0);
  fVar219 = auVar100._0_4_;
  fVar236 = auVar100._4_4_;
  fVar238 = auVar100._8_4_;
  fVar240 = auVar100._12_4_;
  auVar297._0_4_ = fVar219 * auVar251._0_4_ + fVar142 * auVar158._0_4_ + fVar245 * auVar17._0_4_;
  auVar297._4_4_ = fVar236 * auVar251._4_4_ + fVar145 * auVar158._4_4_ + fVar254 * auVar17._4_4_;
  auVar297._8_4_ = fVar238 * auVar251._8_4_ + fVar148 * auVar158._8_4_ + fVar257 * auVar17._8_4_;
  auVar297._12_4_ = fVar240 * auVar251._12_4_ + fVar195 * auVar158._12_4_ + fVar260 * auVar17._12_4_
  ;
  auVar282._0_4_ = fVar219 * auVar18._0_4_ + fVar142 * auVar19._0_4_ + auVar117._0_4_ * fVar245;
  auVar282._4_4_ = fVar236 * auVar18._4_4_ + fVar145 * auVar19._4_4_ + auVar117._4_4_ * fVar254;
  auVar282._8_4_ = fVar238 * auVar18._8_4_ + fVar148 * auVar19._8_4_ + auVar117._8_4_ * fVar257;
  auVar282._12_4_ = fVar240 * auVar18._12_4_ + fVar195 * auVar19._12_4_ + auVar117._12_4_ * fVar260;
  auVar153._0_4_ = fVar219 * auVar20._0_4_ + fVar142 * auVar97._0_4_ + fVar245 * auVar113._0_4_;
  auVar153._4_4_ = fVar236 * auVar20._4_4_ + fVar145 * auVar97._4_4_ + fVar254 * auVar113._4_4_;
  auVar153._8_4_ = fVar238 * auVar20._8_4_ + fVar148 * auVar97._8_4_ + fVar257 * auVar113._8_4_;
  auVar153._12_4_ = fVar240 * auVar20._12_4_ + fVar195 * auVar97._12_4_ + fVar260 * auVar113._12_4_;
  auVar100 = vshufps_avx(auVar197,auVar197,0x55);
  auVar181 = vshufps_avx(auVar197,auVar197,0xaa);
  fVar142 = auVar181._0_4_;
  fVar145 = auVar181._4_4_;
  fVar148 = auVar181._8_4_;
  fVar195 = auVar181._12_4_;
  fVar219 = auVar100._0_4_;
  fVar236 = auVar100._4_4_;
  fVar238 = auVar100._8_4_;
  fVar240 = auVar100._12_4_;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar114 = vpmovsxwd_avx(auVar100);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar115 = vpmovsxwd_avx(auVar181);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar155 = vpmovsxwd_avx(auVar178);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar81 * 0xd + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar100 = vshufps_avx(auVar197,auVar197,0);
  fVar245 = auVar100._0_4_;
  fVar254 = auVar100._4_4_;
  fVar257 = auVar100._8_4_;
  fVar260 = auVar100._12_4_;
  auVar318._0_4_ = auVar251._0_4_ * fVar245 + fVar219 * auVar158._0_4_ + fVar142 * auVar17._0_4_;
  auVar318._4_4_ = auVar251._4_4_ * fVar254 + fVar236 * auVar158._4_4_ + fVar145 * auVar17._4_4_;
  auVar318._8_4_ = auVar251._8_4_ * fVar257 + fVar238 * auVar158._8_4_ + fVar148 * auVar17._8_4_;
  auVar318._12_4_ = auVar251._12_4_ * fVar260 + fVar240 * auVar158._12_4_ + fVar195 * auVar17._12_4_
  ;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar81 * 0x12 + 6);
  auVar158 = vpmovsxwd_avx(auVar158);
  auVar269._0_4_ = auVar117._0_4_ * fVar142 + fVar219 * auVar19._0_4_ + fVar245 * auVar18._0_4_;
  auVar269._4_4_ = auVar117._4_4_ * fVar145 + fVar236 * auVar19._4_4_ + fVar254 * auVar18._4_4_;
  auVar269._8_4_ = auVar117._8_4_ * fVar148 + fVar238 * auVar19._8_4_ + fVar257 * auVar18._8_4_;
  auVar269._12_4_ = auVar117._12_4_ * fVar195 + fVar240 * auVar19._12_4_ + fVar260 * auVar18._12_4_;
  auVar198._0_4_ = fVar245 * auVar20._0_4_ + fVar219 * auVar97._0_4_ + fVar142 * auVar113._0_4_;
  auVar198._4_4_ = fVar254 * auVar20._4_4_ + fVar236 * auVar97._4_4_ + fVar145 * auVar113._4_4_;
  auVar198._8_4_ = fVar257 * auVar20._8_4_ + fVar238 * auVar97._8_4_ + fVar148 * auVar113._8_4_;
  auVar198._12_4_ = fVar260 * auVar20._12_4_ + fVar240 * auVar97._12_4_ + fVar195 * auVar113._12_4_;
  auVar362._8_4_ = 0x7fffffff;
  auVar362._0_8_ = 0x7fffffff7fffffff;
  auVar362._12_4_ = 0x7fffffff;
  auVar100 = vandps_avx(auVar297,auVar362);
  auVar248._8_4_ = 0x219392ef;
  auVar248._0_8_ = 0x219392ef219392ef;
  auVar248._12_4_ = 0x219392ef;
  auVar100 = vcmpps_avx(auVar100,auVar248,1);
  auVar181 = vblendvps_avx(auVar297,auVar248,auVar100);
  auVar100 = vandps_avx(auVar282,auVar362);
  auVar100 = vcmpps_avx(auVar100,auVar248,1);
  auVar178 = vblendvps_avx(auVar282,auVar248,auVar100);
  auVar100 = vandps_avx(auVar362,auVar153);
  auVar100 = vcmpps_avx(auVar100,auVar248,1);
  auVar100 = vblendvps_avx(auVar153,auVar248,auVar100);
  auVar17 = vrcpps_avx(auVar181);
  fVar219 = auVar17._0_4_;
  auVar221._0_4_ = fVar219 * auVar181._0_4_;
  fVar236 = auVar17._4_4_;
  auVar221._4_4_ = fVar236 * auVar181._4_4_;
  fVar238 = auVar17._8_4_;
  auVar221._8_4_ = fVar238 * auVar181._8_4_;
  fVar240 = auVar17._12_4_;
  auVar221._12_4_ = fVar240 * auVar181._12_4_;
  auVar298._8_4_ = 0x3f800000;
  auVar298._0_8_ = 0x3f8000003f800000;
  auVar298._12_4_ = 0x3f800000;
  auVar181 = vsubps_avx(auVar298,auVar221);
  fVar219 = fVar219 + fVar219 * auVar181._0_4_;
  fVar236 = fVar236 + fVar236 * auVar181._4_4_;
  fVar238 = fVar238 + fVar238 * auVar181._8_4_;
  fVar240 = fVar240 + fVar240 * auVar181._12_4_;
  auVar181 = vrcpps_avx(auVar178);
  fVar245 = auVar181._0_4_;
  auVar283._0_4_ = auVar178._0_4_ * fVar245;
  fVar254 = auVar181._4_4_;
  auVar283._4_4_ = auVar178._4_4_ * fVar254;
  fVar257 = auVar181._8_4_;
  auVar283._8_4_ = auVar178._8_4_ * fVar257;
  fVar260 = auVar181._12_4_;
  auVar283._12_4_ = auVar178._12_4_ * fVar260;
  auVar181 = vsubps_avx(auVar298,auVar283);
  fVar245 = auVar181._0_4_ * fVar245 + fVar245;
  fVar254 = auVar181._4_4_ * fVar254 + fVar254;
  fVar257 = auVar181._8_4_ * fVar257 + fVar257;
  fVar260 = auVar181._12_4_ * fVar260 + fVar260;
  auVar181 = vrcpps_avx(auVar100);
  fVar281 = auVar181._0_4_;
  auVar154._0_4_ = fVar281 * auVar100._0_4_;
  fVar292 = auVar181._4_4_;
  auVar154._4_4_ = fVar292 * auVar100._4_4_;
  fVar293 = auVar181._8_4_;
  auVar154._8_4_ = fVar293 * auVar100._8_4_;
  fVar294 = auVar181._12_4_;
  auVar154._12_4_ = fVar294 * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar298,auVar154);
  fVar281 = fVar281 + fVar281 * auVar100._0_4_;
  fVar292 = fVar292 + fVar292 * auVar100._4_4_;
  fVar293 = fVar293 + fVar293 * auVar100._8_4_;
  fVar294 = fVar294 + fVar294 * auVar100._12_4_;
  auVar178 = vpermilps_avx(ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                                          *(float *)(prim + lVar87 + 0x16)) *
                                         *(float *)(prim + lVar87 + 0x1a))),0);
  auVar100 = vcvtdq2ps_avx(auVar114);
  auVar181 = vcvtdq2ps_avx(auVar115);
  auVar181 = vsubps_avx(auVar181,auVar100);
  fVar142 = auVar178._0_4_;
  fVar145 = auVar178._4_4_;
  fVar148 = auVar178._8_4_;
  fVar195 = auVar178._12_4_;
  auVar113._0_4_ = fVar142 * auVar181._0_4_ + auVar100._0_4_;
  auVar113._4_4_ = fVar145 * auVar181._4_4_ + auVar100._4_4_;
  auVar113._8_4_ = fVar148 * auVar181._8_4_ + auVar100._8_4_;
  auVar113._12_4_ = fVar195 * auVar181._12_4_ + auVar100._12_4_;
  auVar100 = vcvtdq2ps_avx(auVar155);
  auVar181 = vcvtdq2ps_avx(auVar95);
  auVar181 = vsubps_avx(auVar181,auVar100);
  auVar173._0_4_ = auVar181._0_4_ * fVar142 + auVar100._0_4_;
  auVar173._4_4_ = auVar181._4_4_ * fVar145 + auVar100._4_4_;
  auVar173._8_4_ = auVar181._8_4_ * fVar148 + auVar100._8_4_;
  auVar173._12_4_ = auVar181._12_4_ * fVar195 + auVar100._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar81 * 0x16 + 6);
  auVar181 = vpmovsxwd_avx(auVar17);
  auVar100 = vcvtdq2ps_avx(auVar158);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar100);
  auVar299._0_4_ = auVar181._0_4_ * fVar142 + auVar100._0_4_;
  auVar299._4_4_ = auVar181._4_4_ * fVar145 + auVar100._4_4_;
  auVar299._8_4_ = auVar181._8_4_ * fVar148 + auVar100._8_4_;
  auVar299._12_4_ = auVar181._12_4_ * fVar195 + auVar100._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar81 * 0x14 + 6);
  auVar100 = vpmovsxwd_avx(auVar19);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar81 * 0x18 + 6);
  auVar181 = vpmovsxwd_avx(auVar117);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar100);
  auVar333._0_4_ = auVar181._0_4_ * fVar142 + auVar100._0_4_;
  auVar333._4_4_ = auVar181._4_4_ * fVar145 + auVar100._4_4_;
  auVar333._8_4_ = auVar181._8_4_ * fVar148 + auVar100._8_4_;
  auVar333._12_4_ = auVar181._12_4_ * fVar195 + auVar100._12_4_;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + uVar81 * 0x1d + 6);
  auVar100 = vpmovsxwd_avx(auVar251);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar81 * 0x21 + 6);
  auVar181 = vpmovsxwd_avx(auVar18);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar178 = vsubps_avx(auVar181,auVar100);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar81 * 0x1f + 6);
  auVar181 = vpmovsxwd_avx(auVar20);
  auVar346._0_4_ = auVar178._0_4_ * fVar142 + auVar100._0_4_;
  auVar346._4_4_ = auVar178._4_4_ * fVar145 + auVar100._4_4_;
  auVar346._8_4_ = auVar178._8_4_ * fVar148 + auVar100._8_4_;
  auVar346._12_4_ = auVar178._12_4_ * fVar195 + auVar100._12_4_;
  auVar100 = vcvtdq2ps_avx(auVar181);
  local_788 = prim;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar81 * 0x23 + 6);
  auVar181 = vpmovsxwd_avx(auVar97);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar100);
  auVar155._0_4_ = auVar100._0_4_ + auVar181._0_4_ * fVar142;
  auVar155._4_4_ = auVar100._4_4_ + auVar181._4_4_ * fVar145;
  auVar155._8_4_ = auVar100._8_4_ + auVar181._8_4_ * fVar148;
  auVar155._12_4_ = auVar100._12_4_ + auVar181._12_4_ * fVar195;
  auVar100 = vsubps_avx(auVar113,auVar318);
  auVar114._0_4_ = fVar219 * auVar100._0_4_;
  auVar114._4_4_ = fVar236 * auVar100._4_4_;
  auVar114._8_4_ = fVar238 * auVar100._8_4_;
  auVar114._12_4_ = fVar240 * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar173,auVar318);
  auVar174._0_4_ = fVar219 * auVar100._0_4_;
  auVar174._4_4_ = fVar236 * auVar100._4_4_;
  auVar174._8_4_ = fVar238 * auVar100._8_4_;
  auVar174._12_4_ = fVar240 * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar299,auVar269);
  auVar222._0_4_ = fVar245 * auVar100._0_4_;
  auVar222._4_4_ = fVar254 * auVar100._4_4_;
  auVar222._8_4_ = fVar257 * auVar100._8_4_;
  auVar222._12_4_ = fVar260 * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar333,auVar269);
  auVar249._0_4_ = fVar245 * auVar100._0_4_;
  auVar249._4_4_ = fVar254 * auVar100._4_4_;
  auVar249._8_4_ = fVar257 * auVar100._8_4_;
  auVar249._12_4_ = fVar260 * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar346,auVar198);
  auVar270._0_4_ = fVar281 * auVar100._0_4_;
  auVar270._4_4_ = fVar292 * auVar100._4_4_;
  auVar270._8_4_ = fVar293 * auVar100._8_4_;
  auVar270._12_4_ = fVar294 * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar155,auVar198);
  auVar156._0_4_ = fVar281 * auVar100._0_4_;
  auVar156._4_4_ = fVar292 * auVar100._4_4_;
  auVar156._8_4_ = fVar293 * auVar100._8_4_;
  auVar156._12_4_ = fVar294 * auVar100._12_4_;
  auVar100 = vpminsd_avx(auVar114,auVar174);
  auVar181 = vpminsd_avx(auVar222,auVar249);
  auVar100 = vmaxps_avx(auVar100,auVar181);
  auVar181 = vpminsd_avx(auVar270,auVar156);
  uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar300._4_4_ = uVar89;
  auVar300._0_4_ = uVar89;
  auVar300._8_4_ = uVar89;
  auVar300._12_4_ = uVar89;
  auVar181 = vmaxps_avx(auVar181,auVar300);
  auVar100 = vmaxps_avx(auVar100,auVar181);
  local_580._0_4_ = auVar100._0_4_ * 0.99999964;
  local_580._4_4_ = auVar100._4_4_ * 0.99999964;
  local_580._8_4_ = auVar100._8_4_ * 0.99999964;
  local_580._12_4_ = auVar100._12_4_ * 0.99999964;
  auVar100 = vpmaxsd_avx(auVar114,auVar174);
  auVar181 = vpmaxsd_avx(auVar222,auVar249);
  auVar100 = vminps_avx(auVar100,auVar181);
  auVar181 = vpmaxsd_avx(auVar270,auVar156);
  fVar245 = (ray->super_RayK<1>).tfar;
  auVar175._4_4_ = fVar245;
  auVar175._0_4_ = fVar245;
  auVar175._8_4_ = fVar245;
  auVar175._12_4_ = fVar245;
  auVar181 = vminps_avx(auVar181,auVar175);
  auVar100 = vminps_avx(auVar100,auVar181);
  auVar181 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar181 = vpcmpgtd_avx(auVar181,_DAT_01f4ad30);
  auVar115._0_4_ = auVar100._0_4_ * 1.0000004;
  auVar115._4_4_ = auVar100._4_4_ * 1.0000004;
  auVar115._8_4_ = auVar100._8_4_ * 1.0000004;
  auVar115._12_4_ = auVar100._12_4_ * 1.0000004;
  auVar100 = vcmpps_avx(local_580,auVar115,2);
  auVar100 = vandps_avx(auVar100,auVar181);
  uVar89 = vmovmskps_avx(auVar100);
  uVar81 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar89);
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
LAB_0092135a:
  if (uVar81 == 0) {
    return;
  }
  lVar87 = 0;
  if (uVar81 != 0) {
    for (; (uVar81 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
    }
  }
  uVar84 = *(uint *)(local_788 + 2);
  pGVar12 = (context->scene->geometries).items[uVar84].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)*(uint *)(local_788 + lVar87 * 4 + 6) *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar245 = (pGVar12->time_range).lower;
  fVar245 = pGVar12->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar245) /
            ((pGVar12->time_range).upper - fVar245));
  auVar100 = vroundss_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),9);
  auVar100 = vminss_avx(auVar100,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar100 = vmaxss_avx(ZEXT816(0) << 0x20,auVar100);
  fVar245 = fVar245 - auVar100._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar88 = (long)(int)auVar100._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + lVar88);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar88);
  auVar100 = vshufps_avx(ZEXT416((uint)(1.0 - fVar245)),ZEXT416((uint)(1.0 - fVar245)),0);
  pfVar1 = (float *)(lVar14 + lVar15 * uVar82);
  fVar254 = auVar100._0_4_;
  fVar257 = auVar100._4_4_;
  fVar142 = auVar100._8_4_;
  fVar148 = auVar100._12_4_;
  pfVar2 = (float *)(lVar14 + lVar15 * (uVar82 + 1));
  pfVar3 = (float *)(lVar14 + lVar15 * (uVar82 + 2));
  pfVar4 = (float *)(lVar14 + lVar15 * (uVar82 + 3));
  lVar14 = *(long *)(_Var13 + 0x38 + lVar88);
  lVar15 = *(long *)(_Var13 + 0x48 + lVar88);
  auVar100 = vshufps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),0);
  pfVar5 = (float *)(lVar14 + uVar82 * lVar15);
  fVar195 = auVar100._0_4_;
  fVar219 = auVar100._4_4_;
  fVar236 = auVar100._8_4_;
  fVar238 = auVar100._12_4_;
  pfVar6 = (float *)(lVar14 + (uVar82 + 1) * lVar15);
  pfVar7 = (float *)(lVar14 + (uVar82 + 2) * lVar15);
  auVar176._0_4_ = fVar195 * *pfVar5 + fVar254 * *pfVar1;
  auVar176._4_4_ = fVar219 * pfVar5[1] + fVar257 * pfVar1[1];
  auVar176._8_4_ = fVar236 * pfVar5[2] + fVar142 * pfVar1[2];
  auVar176._12_4_ = fVar238 * pfVar5[3] + fVar148 * pfVar1[3];
  auVar199._0_4_ = fVar254 * *pfVar2 + fVar195 * *pfVar6;
  auVar199._4_4_ = fVar257 * pfVar2[1] + fVar219 * pfVar6[1];
  auVar199._8_4_ = fVar142 * pfVar2[2] + fVar236 * pfVar6[2];
  auVar199._12_4_ = fVar148 * pfVar2[3] + fVar238 * pfVar6[3];
  auVar223._0_4_ = fVar254 * *pfVar3 + fVar195 * *pfVar7;
  auVar223._4_4_ = fVar257 * pfVar3[1] + fVar219 * pfVar7[1];
  auVar223._8_4_ = fVar142 * pfVar3[2] + fVar236 * pfVar7[2];
  auVar223._12_4_ = fVar148 * pfVar3[3] + fVar238 * pfVar7[3];
  auVar92._0_4_ = (auVar176._0_4_ + auVar199._0_4_) * 0.5;
  auVar92._4_4_ = (auVar176._4_4_ + auVar199._4_4_) * 0.5;
  auVar92._8_4_ = (auVar176._8_4_ + auVar199._8_4_) * 0.5;
  auVar92._12_4_ = (auVar176._12_4_ + auVar199._12_4_) * 0.5;
  aVar9 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar100 = vsubps_avx(auVar92,(undefined1  [16])aVar9);
  auVar100 = vdpps_avx(auVar100,(undefined1  [16])aVar10,0x7f);
  auVar181 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar178 = vrcpss_avx(auVar181,auVar181);
  auVar324 = ZEXT464(0x40000000);
  fVar245 = auVar178._0_4_ * (2.0 - auVar181._0_4_ * auVar178._0_4_) * auVar100._0_4_;
  local_7a0 = ZEXT416((uint)fVar245);
  auVar181 = vshufps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),0);
  fVar245 = aVar10.x;
  fVar260 = aVar10.y;
  fVar145 = aVar10.z;
  aVar141 = aVar10.field_3;
  auVar271._0_4_ = fVar245 * auVar181._0_4_ + aVar9.x;
  auVar271._4_4_ = fVar260 * auVar181._4_4_ + aVar9.y;
  auVar271._8_4_ = fVar145 * auVar181._8_4_ + aVar9.z;
  auVar271._12_4_ = aVar141.w * auVar181._12_4_ + aVar9.field_3.w;
  auVar100 = vblendps_avx(auVar271,_DAT_01f45a50,8);
  auVar17 = vsubps_avx(auVar176,auVar100);
  auVar290 = ZEXT1664(auVar17);
  pfVar1 = (float *)(lVar14 + lVar15 * (uVar82 + 3));
  auVar19 = vsubps_avx(auVar223,auVar100);
  auVar157._0_4_ = fVar254 * *pfVar4 + fVar195 * *pfVar1;
  auVar157._4_4_ = fVar257 * pfVar4[1] + fVar219 * pfVar1[1];
  auVar157._8_4_ = fVar142 * pfVar4[2] + fVar236 * pfVar1[2];
  auVar157._12_4_ = fVar148 * pfVar4[3] + fVar238 * pfVar1[3];
  _local_930 = vsubps_avx(auVar199,auVar100);
  auVar215 = ZEXT1664(_local_930);
  _local_940 = vsubps_avx(auVar157,auVar100);
  auVar100 = vshufps_avx(auVar17,auVar17,0);
  auVar178 = vshufps_avx(auVar17,auVar17,0x55);
  register0x00001290 = auVar178;
  _local_380 = auVar178;
  auVar178 = vshufps_avx(auVar17,auVar17,0xaa);
  register0x00001290 = auVar178;
  _local_1e0 = auVar178;
  auVar178 = vshufps_avx(auVar17,auVar17,0xff);
  register0x00001290 = auVar178;
  _local_200 = auVar178;
  auVar178 = vshufps_avx(_local_930,_local_930,0);
  register0x00001290 = auVar178;
  _local_3a0 = auVar178;
  auVar178 = vshufps_avx(_local_930,_local_930,0x55);
  register0x00001290 = auVar178;
  _local_3c0 = auVar178;
  auVar178 = vshufps_avx(_local_930,_local_930,0xaa);
  register0x00001290 = auVar178;
  _local_3e0 = auVar178;
  auVar116._0_4_ = fVar245 * fVar245;
  auVar116._4_4_ = fVar260 * fVar260;
  auVar116._8_4_ = fVar145 * fVar145;
  auVar116._12_4_ = aVar141.w * aVar141.w;
  auVar178 = vshufps_avx(auVar116,auVar116,0xaa);
  auVar95 = vshufps_avx(auVar116,auVar116,0x55);
  auVar158 = vshufps_avx(_local_930,_local_930,0xff);
  register0x000012d0 = auVar158;
  _local_220 = auVar158;
  auVar158 = vshufps_avx(auVar116,auVar116,0);
  local_240._0_4_ = auVar158._0_4_ + auVar95._0_4_ + auVar178._0_4_;
  local_240._4_4_ = auVar158._4_4_ + auVar95._4_4_ + auVar178._4_4_;
  local_240._8_4_ = auVar158._8_4_ + auVar95._8_4_ + auVar178._8_4_;
  local_240._12_4_ = auVar158._12_4_ + auVar95._12_4_ + auVar178._12_4_;
  local_240._16_4_ = auVar158._0_4_ + auVar95._0_4_ + auVar178._0_4_;
  local_240._20_4_ = auVar158._4_4_ + auVar95._4_4_ + auVar178._4_4_;
  local_240._24_4_ = auVar158._8_4_ + auVar95._8_4_ + auVar178._8_4_;
  local_240._28_4_ = auVar158._12_4_ + auVar95._12_4_ + auVar178._12_4_;
  auVar178 = vshufps_avx(auVar19,auVar19,0);
  register0x00001550 = auVar178;
  _local_8a0 = auVar178;
  auVar366 = ZEXT3264(_local_8a0);
  auVar178 = vshufps_avx(auVar19,auVar19,0x55);
  register0x00001250 = auVar178;
  _local_400 = auVar178;
  auVar178 = vshufps_avx(auVar19,auVar19,0xaa);
  register0x00001250 = auVar178;
  _local_420 = auVar178;
  auVar178 = vshufps_avx(auVar19,auVar19,0xff);
  register0x00001250 = auVar178;
  _local_440 = auVar178;
  auVar178 = vshufps_avx(_local_940,_local_940,0);
  register0x00001510 = auVar178;
  _local_920 = auVar178;
  auVar348 = ZEXT3264(_local_920);
  auVar178 = vshufps_avx(_local_940,_local_940,0x55);
  local_480._16_16_ = auVar178;
  local_480._0_16_ = auVar178;
  auVar178 = vshufps_avx(_local_940,_local_940,0xaa);
  register0x00001250 = auVar178;
  _local_460 = auVar178;
  auVar178 = vshufps_avx(_local_940,_local_940,0xff);
  register0x00001250 = auVar178;
  _local_260 = auVar178;
  register0x00001210 = auVar181;
  _local_780 = auVar181;
  uVar86 = 0;
  local_aec = 1;
  local_5c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  local_700 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  local_5a0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_240,auVar102);
  local_570 = ZEXT816(0x3f80000000000000);
  uVar82 = (ulong)*(uint *)(local_788 + lVar87 * 4 + 6);
  do {
    auVar181 = vmovshdup_avx(local_570);
    auVar95 = vsubps_avx(auVar181,local_570);
    auVar181 = vshufps_avx(local_570,local_570,0);
    local_860._16_16_ = auVar181;
    local_860._0_16_ = auVar181;
    auVar178 = vshufps_avx(auVar95,auVar95,0);
    local_880._16_16_ = auVar178;
    local_880._0_16_ = auVar178;
    fVar254 = auVar178._0_4_;
    fVar195 = auVar178._4_4_;
    fVar292 = auVar178._8_4_;
    fVar196 = auVar178._12_4_;
    fVar91 = auVar181._0_4_;
    auVar189._0_4_ = fVar91 + fVar254 * 0.0;
    fVar110 = auVar181._4_4_;
    auVar189._4_4_ = fVar110 + fVar195 * 0.14285715;
    fVar111 = auVar181._8_4_;
    auVar189._8_4_ = fVar111 + fVar292 * 0.2857143;
    fVar112 = auVar181._12_4_;
    auVar189._12_4_ = fVar112 + fVar196 * 0.42857146;
    auVar189._16_4_ = fVar91 + fVar254 * 0.5714286;
    auVar189._20_4_ = fVar110 + fVar195 * 0.71428573;
    auVar189._24_4_ = fVar111 + fVar292 * 0.8571429;
    auVar189._28_4_ = fVar112 + fVar196;
    auVar126._8_4_ = 0x3f800000;
    auVar126._0_8_ = 0x3f8000003f800000;
    auVar126._12_4_ = 0x3f800000;
    auVar126._16_4_ = 0x3f800000;
    auVar126._20_4_ = 0x3f800000;
    auVar126._24_4_ = 0x3f800000;
    auVar126._28_4_ = 0x3f800000;
    auVar101 = vsubps_avx(auVar126,auVar189);
    auVar165._0_4_ = auVar189._0_4_ * auVar189._0_4_;
    auVar165._4_4_ = auVar189._4_4_ * auVar189._4_4_;
    auVar165._8_4_ = auVar189._8_4_ * auVar189._8_4_;
    auVar165._12_4_ = auVar189._12_4_ * auVar189._12_4_;
    auVar165._16_4_ = auVar189._16_4_ * auVar189._16_4_;
    auVar165._20_4_ = auVar189._20_4_ * auVar189._20_4_;
    auVar165._24_4_ = auVar189._24_4_ * auVar189._24_4_;
    auVar165._28_4_ = 0;
    fVar240 = auVar189._0_4_ * 3.0;
    fVar281 = auVar189._4_4_ * 3.0;
    fVar293 = auVar189._8_4_ * 3.0;
    fVar294 = auVar189._12_4_ * 3.0;
    fVar216 = auVar189._16_4_ * 3.0;
    fVar217 = auVar189._20_4_ * 3.0;
    fVar218 = auVar189._24_4_ * 3.0;
    fVar280 = auVar215._28_4_ + -5.0;
    fVar257 = auVar101._0_4_;
    auVar291._0_4_ = fVar257 * fVar257;
    fVar260 = auVar101._4_4_;
    auVar291._4_4_ = fVar260 * fVar260;
    fVar142 = auVar101._8_4_;
    auVar291._8_4_ = fVar142 * fVar142;
    fVar145 = auVar101._12_4_;
    auVar291._12_4_ = fVar145 * fVar145;
    fVar148 = auVar101._16_4_;
    auVar291._16_4_ = fVar148 * fVar148;
    fVar219 = auVar101._20_4_;
    auVar291._20_4_ = fVar219 * fVar219;
    fVar236 = auVar101._24_4_;
    auVar291._28_36_ = auVar290._28_36_;
    auVar291._24_4_ = fVar236 * fVar236;
    fVar238 = auVar101._28_4_;
    fVar220 = (auVar291._0_4_ * (fVar257 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar237 = (auVar291._4_4_ * (fVar260 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar239 = (auVar291._8_4_ * (fVar142 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar241 = (auVar291._12_4_ * (fVar145 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar242 = (auVar291._16_4_ * (fVar148 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar243 = (auVar291._20_4_ * (fVar219 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar244 = (auVar291._24_4_ * (fVar236 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar295 = -fVar257 * auVar189._0_4_ * auVar189._0_4_ * 0.5;
    fVar304 = -fVar260 * auVar189._4_4_ * auVar189._4_4_ * 0.5;
    fVar306 = -fVar142 * auVar189._8_4_ * auVar189._8_4_ * 0.5;
    fVar308 = -fVar145 * auVar189._12_4_ * auVar189._12_4_ * 0.5;
    fVar310 = -fVar148 * auVar189._16_4_ * auVar189._16_4_ * 0.5;
    fVar312 = -fVar219 * auVar189._20_4_ * auVar189._20_4_ * 0.5;
    fVar314 = -fVar236 * auVar189._24_4_ * auVar189._24_4_ * 0.5;
    fVar245 = auVar366._28_4_;
    fVar331 = auVar324._28_4_ + fVar245;
    fVar342 = local_480._28_4_ + fVar245;
    fVar361 = (auVar165._0_4_ * (fVar240 + -5.0) + 2.0) * 0.5;
    fVar367 = (auVar165._4_4_ * (fVar281 + -5.0) + 2.0) * 0.5;
    fVar368 = (auVar165._8_4_ * (fVar293 + -5.0) + 2.0) * 0.5;
    fVar369 = (auVar165._12_4_ * (fVar294 + -5.0) + 2.0) * 0.5;
    fVar370 = (auVar165._16_4_ * (fVar216 + -5.0) + 2.0) * 0.5;
    fVar371 = (auVar165._20_4_ * (fVar217 + -5.0) + 2.0) * 0.5;
    fVar372 = (auVar165._24_4_ * (fVar218 + -5.0) + 2.0) * 0.5;
    fVar343 = -auVar189._0_4_ * fVar257 * fVar257 * 0.5;
    fVar349 = -auVar189._4_4_ * fVar260 * fVar260 * 0.5;
    fVar351 = -auVar189._8_4_ * fVar142 * fVar142 * 0.5;
    fVar353 = -auVar189._12_4_ * fVar145 * fVar145 * 0.5;
    fVar355 = -auVar189._16_4_ * fVar148 * fVar148 * 0.5;
    fVar357 = -auVar189._20_4_ * fVar219 * fVar219 * 0.5;
    fVar359 = -auVar189._24_4_ * fVar236 * fVar236 * 0.5;
    fVar138 = auVar100._0_4_;
    fVar139 = auVar100._4_4_;
    fVar140 = auVar100._8_4_;
    local_7c0 = fVar138 * fVar343 +
                fVar361 * (float)local_3a0._0_4_ +
                auVar348._0_4_ * fVar295 + auVar366._0_4_ * fVar220;
    fStack_7bc = fVar139 * fVar349 +
                 fVar367 * (float)local_3a0._4_4_ +
                 auVar348._4_4_ * fVar304 + auVar366._4_4_ * fVar237;
    fStack_7b8 = fVar140 * fVar351 +
                 fVar368 * fStack_398 + auVar348._8_4_ * fVar306 + auVar366._8_4_ * fVar239;
    aStack_7b4.w = auVar100._12_4_ * fVar353 +
                   fVar369 * fStack_394 + auVar348._12_4_ * fVar308 + auVar366._12_4_ * fVar241;
    fStack_7b0 = fVar138 * fVar355 +
                 fVar370 * fStack_390 + auVar348._16_4_ * fVar310 + auVar366._16_4_ * fVar242;
    fStack_7ac = fVar139 * fVar357 +
                 fVar371 * fStack_38c + auVar348._20_4_ * fVar312 + auVar366._20_4_ * fVar243;
    fStack_7a8 = fVar140 * fVar359 +
                 fVar372 * fStack_388 + auVar348._24_4_ * fVar314 + auVar366._24_4_ * fVar244;
    fStack_7a4 = fVar245 + 2.0 + -fVar238 + fVar331;
    fVar296 = fVar343 * (float)local_380._0_4_ +
              fVar361 * (float)local_3c0._0_4_ +
              local_480._0_4_ * fVar295 + fVar220 * (float)local_400._0_4_;
    fVar305 = fVar349 * (float)local_380._4_4_ +
              fVar367 * (float)local_3c0._4_4_ +
              local_480._4_4_ * fVar304 + fVar237 * (float)local_400._4_4_;
    fVar307 = fVar351 * fStack_378 +
              fVar368 * fStack_3b8 + local_480._8_4_ * fVar306 + fVar239 * fStack_3f8;
    fVar309 = fVar353 * fStack_374 +
              fVar369 * fStack_3b4 + local_480._12_4_ * fVar308 + fVar241 * fStack_3f4;
    fVar311 = fVar355 * fStack_370 +
              fVar370 * fStack_3b0 + local_480._16_4_ * fVar310 + fVar242 * fStack_3f0;
    fVar313 = fVar357 * fStack_36c +
              fVar371 * fStack_3ac + local_480._20_4_ * fVar312 + fVar243 * fStack_3ec;
    fVar315 = fVar359 * fStack_368 +
              fVar372 * fStack_3a8 + local_480._24_4_ * fVar314 + fVar244 * fStack_3e8;
    fVar316 = fStack_7a4 + fVar331 + fVar342;
    local_9a0 = (float)local_1e0._0_4_ * fVar343 +
                fVar361 * (float)local_3e0._0_4_ +
                fVar295 * (float)local_460._0_4_ + fVar220 * (float)local_420._0_4_;
    fStack_99c = (float)local_1e0._4_4_ * fVar349 +
                 fVar367 * (float)local_3e0._4_4_ +
                 fVar304 * (float)local_460._4_4_ + fVar237 * (float)local_420._4_4_;
    fStack_998 = fStack_1d8 * fVar351 +
                 fVar368 * fStack_3d8 + fVar306 * fStack_458 + fVar239 * fStack_418;
    fStack_994 = fStack_1d4 * fVar353 +
                 fVar369 * fStack_3d4 + fVar308 * fStack_454 + fVar241 * fStack_414;
    fStack_990 = fStack_1d0 * fVar355 +
                 fVar370 * fStack_3d0 + fVar310 * fStack_450 + fVar242 * fStack_410;
    fStack_98c = fStack_1cc * fVar357 +
                 fVar371 * fStack_3cc + fVar312 * fStack_44c + fVar243 * fStack_40c;
    fStack_988 = fStack_1c8 * fVar359 +
                 fVar372 * fStack_3c8 + fVar314 * fStack_448 + fVar244 * fStack_408;
    fStack_984 = fVar316 + fVar342 + auVar348._28_4_ + fVar245;
    local_6c0._0_4_ =
         (float)local_200._0_4_ * fVar343 +
         (float)local_220._0_4_ * fVar361 +
         fVar295 * (float)local_260._0_4_ + fVar220 * (float)local_440._0_4_;
    local_6c0._4_4_ =
         (float)local_200._4_4_ * fVar349 +
         (float)local_220._4_4_ * fVar367 +
         fVar304 * (float)local_260._4_4_ + fVar237 * (float)local_440._4_4_;
    local_6c0._8_4_ =
         fStack_1f8 * fVar351 + fStack_218 * fVar368 + fVar306 * fStack_258 + fVar239 * fStack_438;
    local_6c0._12_4_ =
         fStack_1f4 * fVar353 + fStack_214 * fVar369 + fVar308 * fStack_254 + fVar241 * fStack_434;
    local_6c0._16_4_ =
         fStack_1f0 * fVar355 + fStack_210 * fVar370 + fVar310 * fStack_250 + fVar242 * fStack_430;
    local_6c0._20_4_ =
         fStack_1ec * fVar357 + fStack_20c * fVar371 + fVar312 * fStack_24c + fVar243 * fStack_42c;
    local_6c0._24_4_ =
         fStack_1e8 * fVar359 + fStack_208 * fVar372 + fVar314 * fStack_248 + fVar244 * fStack_428;
    local_6c0._28_4_ = fVar316 + fVar245 + 2.0 + -fVar238 + fVar112 + -5.0 + 2.0;
    fVar343 = fVar238 + fVar238;
    fVar349 = auVar189._28_4_ + auVar189._28_4_;
    auVar130._4_4_ = (fVar260 + fVar260) * auVar189._4_4_;
    auVar130._0_4_ = (fVar257 + fVar257) * auVar189._0_4_;
    auVar130._8_4_ = (fVar142 + fVar142) * auVar189._8_4_;
    auVar130._12_4_ = (fVar145 + fVar145) * auVar189._12_4_;
    auVar130._16_4_ = (fVar148 + fVar148) * auVar189._16_4_;
    auVar130._20_4_ = (fVar219 + fVar219) * auVar189._20_4_;
    auVar130._24_4_ = (fVar236 + fVar236) * auVar189._24_4_;
    auVar130._28_4_ = fVar349;
    auVar101 = vsubps_avx(auVar130,auVar291._0_32_);
    auVar21._4_4_ = (fVar260 + fVar260) * (fVar281 + 2.0);
    auVar21._0_4_ = (fVar257 + fVar257) * (fVar240 + 2.0);
    auVar21._8_4_ = (fVar142 + fVar142) * (fVar293 + 2.0);
    auVar21._12_4_ = (fVar145 + fVar145) * (fVar294 + 2.0);
    auVar21._16_4_ = (fVar148 + fVar148) * (fVar216 + 2.0);
    auVar21._20_4_ = (fVar219 + fVar219) * (fVar217 + 2.0);
    auVar21._24_4_ = (fVar236 + fVar236) * (fVar218 + 2.0);
    auVar21._28_4_ = auVar215._28_4_ + 2.0;
    auVar191._4_4_ = fVar260 * fVar260 * 3.0;
    auVar191._0_4_ = fVar257 * fVar257 * 3.0;
    auVar191._8_4_ = fVar142 * fVar142 * 3.0;
    auVar191._12_4_ = fVar145 * fVar145 * 3.0;
    auVar191._16_4_ = fVar148 * fVar148 * 3.0;
    auVar191._20_4_ = fVar219 * fVar219 * 3.0;
    auVar191._24_4_ = fVar236 * fVar236 * 3.0;
    auVar191._28_4_ = fVar238;
    auVar102 = vsubps_avx(auVar21,auVar191);
    auVar130 = vsubps_avx(auVar165,auVar130);
    fVar306 = auVar101._0_4_ * 0.5;
    fVar308 = auVar101._4_4_ * 0.5;
    fVar310 = auVar101._8_4_ * 0.5;
    fVar312 = auVar101._12_4_ * 0.5;
    fVar314 = auVar101._16_4_ * 0.5;
    fVar331 = auVar101._20_4_ * 0.5;
    fVar342 = auVar101._24_4_ * 0.5;
    fVar220 = (auVar189._0_4_ * fVar240 + (auVar189._0_4_ + auVar189._0_4_) * (fVar240 + -5.0)) *
              0.5;
    fVar237 = (auVar189._4_4_ * fVar281 + (auVar189._4_4_ + auVar189._4_4_) * (fVar281 + -5.0)) *
              0.5;
    fVar239 = (auVar189._8_4_ * fVar293 + (auVar189._8_4_ + auVar189._8_4_) * (fVar293 + -5.0)) *
              0.5;
    fVar241 = (auVar189._12_4_ * fVar294 + (auVar189._12_4_ + auVar189._12_4_) * (fVar294 + -5.0)) *
              0.5;
    fVar242 = (auVar189._16_4_ * fVar216 + (auVar189._16_4_ + auVar189._16_4_) * (fVar216 + -5.0)) *
              0.5;
    fVar243 = (auVar189._20_4_ * fVar217 + (auVar189._20_4_ + auVar189._20_4_) * (fVar217 + -5.0)) *
              0.5;
    fVar244 = (auVar189._24_4_ * fVar218 + (auVar189._24_4_ + auVar189._24_4_) * (fVar218 + -5.0)) *
              0.5;
    fVar245 = auVar102._0_4_ * 0.5;
    fVar257 = auVar102._4_4_ * 0.5;
    fVar260 = auVar102._8_4_ * 0.5;
    fVar142 = auVar102._12_4_ * 0.5;
    fVar145 = auVar102._16_4_ * 0.5;
    fVar148 = auVar102._20_4_ * 0.5;
    fVar219 = auVar102._24_4_ * 0.5;
    fVar236 = auVar130._0_4_ * 0.5;
    fVar238 = auVar130._4_4_ * 0.5;
    fVar240 = auVar130._8_4_ * 0.5;
    fVar281 = auVar130._12_4_ * 0.5;
    fVar293 = auVar130._16_4_ * 0.5;
    fVar294 = auVar130._20_4_ * 0.5;
    fVar216 = auVar130._24_4_ * 0.5;
    fVar304 = auVar189._28_4_ + fVar280 + fVar343 + 0.5 + fVar343 + fVar280;
    auVar181 = vpermilps_avx(ZEXT416((uint)(auVar95._0_4_ * 0.04761905)),0);
    fVar218 = auVar181._0_4_;
    fVar332 = fVar218 * (fVar138 * fVar306 +
                        fVar220 * (float)local_3a0._0_4_ +
                        fVar245 * (float)local_8a0._0_4_ + fVar236 * (float)local_920._0_4_);
    fVar280 = auVar181._4_4_;
    fVar336 = fVar280 * (fVar139 * fVar308 +
                        fVar237 * (float)local_3a0._4_4_ +
                        fVar257 * (float)local_8a0._4_4_ + fVar238 * (float)local_920._4_4_);
    auVar285._4_4_ = fVar336;
    auVar285._0_4_ = fVar332;
    fVar295 = auVar181._8_4_;
    fVar337 = fVar295 * (fVar140 * fVar310 +
                        fVar239 * fStack_398 + fVar260 * fStack_898 + fVar240 * fStack_918);
    auVar285._8_4_ = fVar337;
    fVar217 = auVar181._12_4_;
    fVar338 = fVar217 * (auVar100._12_4_ * fVar312 +
                        fVar241 * fStack_394 + fVar142 * fStack_894 + fVar281 * fStack_914);
    auVar285._12_4_ = fVar338;
    fVar339 = fVar218 * (fVar138 * fVar314 +
                        fVar242 * fStack_390 + fVar145 * fStack_890 + fVar293 * fStack_910);
    auVar285._16_4_ = fVar339;
    fVar340 = fVar280 * (fVar139 * fVar331 +
                        fVar243 * fStack_38c + fVar148 * fStack_88c + fVar294 * fStack_90c);
    auVar285._20_4_ = fVar340;
    fVar341 = fVar295 * (fVar140 * fVar342 +
                        fVar244 * fStack_388 + fVar219 * fStack_888 + fVar216 * fStack_908);
    auVar285._24_4_ = fVar341;
    auVar285._28_4_ = uStack_1c4;
    fVar317 = fVar218 * (fVar306 * (float)local_380._0_4_ +
                        fVar220 * (float)local_3c0._0_4_ +
                        fVar245 * (float)local_400._0_4_ + fVar236 * local_480._0_4_);
    fVar325 = fVar280 * (fVar308 * (float)local_380._4_4_ +
                        fVar237 * (float)local_3c0._4_4_ +
                        fVar257 * (float)local_400._4_4_ + fVar238 * local_480._4_4_);
    auVar24._4_4_ = fVar325;
    auVar24._0_4_ = fVar317;
    fVar326 = fVar295 * (fVar310 * fStack_378 +
                        fVar239 * fStack_3b8 + fVar260 * fStack_3f8 + fVar240 * local_480._8_4_);
    auVar24._8_4_ = fVar326;
    fVar327 = fVar217 * (fVar312 * fStack_374 +
                        fVar241 * fStack_3b4 + fVar142 * fStack_3f4 + fVar281 * local_480._12_4_);
    auVar24._12_4_ = fVar327;
    fVar328 = fVar218 * (fVar314 * fStack_370 +
                        fVar242 * fStack_3b0 + fVar145 * fStack_3f0 + fVar293 * local_480._16_4_);
    auVar24._16_4_ = fVar328;
    fVar329 = fVar280 * (fVar331 * fStack_36c +
                        fVar243 * fStack_3ac + fVar148 * fStack_3ec + fVar294 * local_480._20_4_);
    auVar24._20_4_ = fVar329;
    fVar330 = fVar295 * (fVar342 * fStack_368 +
                        fVar244 * fStack_3a8 + fVar219 * fStack_3e8 + fVar216 * local_480._24_4_);
    auVar24._24_4_ = fVar330;
    auVar24._28_4_ = fVar349;
    local_900._0_4_ =
         fVar218 * ((float)local_1e0._0_4_ * fVar306 +
                   fVar245 * (float)local_420._0_4_ + fVar236 * (float)local_460._0_4_ +
                   fVar220 * (float)local_3e0._0_4_);
    local_900._4_4_ =
         fVar280 * ((float)local_1e0._4_4_ * fVar308 +
                   fVar257 * (float)local_420._4_4_ + fVar238 * (float)local_460._4_4_ +
                   fVar237 * (float)local_3e0._4_4_);
    local_900._8_4_ =
         fVar295 * (fStack_1d8 * fVar310 +
                   fVar260 * fStack_418 + fVar240 * fStack_458 + fVar239 * fStack_3d8);
    local_900._12_4_ =
         fVar217 * (fStack_1d4 * fVar312 +
                   fVar142 * fStack_414 + fVar281 * fStack_454 + fVar241 * fStack_3d4);
    local_900._16_4_ =
         fVar218 * (fStack_1d0 * fVar314 +
                   fVar145 * fStack_410 + fVar293 * fStack_450 + fVar242 * fStack_3d0);
    local_900._20_4_ =
         fVar280 * (fStack_1cc * fVar331 +
                   fVar148 * fStack_40c + fVar294 * fStack_44c + fVar243 * fStack_3cc);
    local_900._24_4_ =
         fVar295 * (fStack_1c8 * fVar342 +
                   fVar219 * fStack_408 + fVar216 * fStack_448 + fVar244 * fStack_3c8);
    local_900._28_4_ = 0;
    fVar220 = fVar218 * ((float)local_200._0_4_ * fVar306 +
                        (float)local_220._0_4_ * fVar220 +
                        fVar245 * (float)local_440._0_4_ + (float)local_260._0_4_ * fVar236);
    fVar238 = fVar280 * ((float)local_200._4_4_ * fVar308 +
                        (float)local_220._4_4_ * fVar237 +
                        fVar257 * (float)local_440._4_4_ + (float)local_260._4_4_ * fVar238);
    local_9c0._4_4_ = fVar238;
    local_9c0._0_4_ = fVar220;
    fVar240 = fVar295 * (fStack_1f8 * fVar310 +
                        fStack_218 * fVar239 + fVar260 * fStack_438 + fStack_258 * fVar240);
    local_9c0._8_4_ = fVar240;
    fVar217 = fVar217 * (fStack_1f4 * fVar312 +
                        fStack_214 * fVar241 + fVar142 * fStack_434 + fStack_254 * fVar281);
    local_9c0._12_4_ = fVar217;
    fVar218 = fVar218 * (fStack_1f0 * fVar314 +
                        fStack_210 * fVar242 + fVar145 * fStack_430 + fStack_250 * fVar293);
    local_9c0._16_4_ = fVar218;
    fVar280 = fVar280 * (fStack_1ec * fVar331 +
                        fStack_20c * fVar243 + fVar148 * fStack_42c + fStack_24c * fVar294);
    local_9c0._20_4_ = fVar280;
    fVar295 = fVar295 * (fStack_1e8 * fVar342 +
                        fStack_208 * fVar244 + fVar219 * fStack_428 + fStack_248 * fVar216);
    local_9c0._24_4_ = fVar295;
    local_9c0._28_4_ = fVar304;
    auVar72._4_4_ = fVar305;
    auVar72._0_4_ = fVar296;
    auVar72._8_4_ = fVar307;
    auVar72._12_4_ = fVar309;
    auVar72._16_4_ = fVar311;
    auVar72._20_4_ = fVar313;
    auVar72._24_4_ = fVar315;
    auVar72._28_4_ = fVar316;
    auVar101 = vperm2f128_avx(auVar72,auVar72,1);
    auVar101 = vshufps_avx(auVar101,auVar72,0x30);
    auVar21 = vshufps_avx(auVar72,auVar101,0x29);
    auVar74._4_4_ = fStack_99c;
    auVar74._0_4_ = local_9a0;
    auVar74._8_4_ = fStack_998;
    auVar74._12_4_ = fStack_994;
    auVar74._16_4_ = fStack_990;
    auVar74._20_4_ = fStack_98c;
    auVar74._24_4_ = fStack_988;
    auVar74._28_4_ = fStack_984;
    auVar101 = vperm2f128_avx(auVar74,auVar74,1);
    auVar101 = vshufps_avx(auVar101,auVar74,0x30);
    local_7e0 = vshufps_avx(auVar74,auVar101,0x29);
    auVar102 = vsubps_avx(local_6c0,local_9c0);
    auVar101 = vperm2f128_avx(auVar102,auVar102,1);
    auVar101 = vshufps_avx(auVar101,auVar102,0x30);
    local_6e0 = vshufps_avx(auVar102,auVar101,0x29);
    local_620 = vsubps_avx(auVar21,auVar72);
    local_760 = vsubps_avx(local_7e0,auVar74);
    fVar257 = local_620._0_4_;
    fVar219 = local_620._4_4_;
    auVar23._4_4_ = local_900._4_4_ * fVar219;
    auVar23._0_4_ = (float)local_900._0_4_ * fVar257;
    fVar293 = local_620._8_4_;
    auVar23._8_4_ = local_900._8_4_ * fVar293;
    fVar239 = local_620._12_4_;
    auVar23._12_4_ = local_900._12_4_ * fVar239;
    fVar243 = local_620._16_4_;
    auVar23._16_4_ = local_900._16_4_ * fVar243;
    fVar306 = local_620._20_4_;
    auVar23._20_4_ = local_900._20_4_ * fVar306;
    fVar331 = local_620._24_4_;
    auVar23._24_4_ = local_900._24_4_ * fVar331;
    auVar23._28_4_ = auVar102._28_4_;
    fVar260 = local_760._0_4_;
    fVar236 = local_760._4_4_;
    auVar190._4_4_ = fVar325 * fVar236;
    auVar190._0_4_ = fVar317 * fVar260;
    fVar294 = local_760._8_4_;
    auVar190._8_4_ = fVar326 * fVar294;
    fVar241 = local_760._12_4_;
    auVar190._12_4_ = fVar327 * fVar241;
    fVar244 = local_760._16_4_;
    auVar190._16_4_ = fVar328 * fVar244;
    fVar308 = local_760._20_4_;
    auVar190._20_4_ = fVar329 * fVar308;
    fVar342 = local_760._24_4_;
    auVar190._24_4_ = fVar330 * fVar342;
    auVar190._28_4_ = auVar101._28_4_;
    auVar130 = vsubps_avx(auVar190,auVar23);
    auVar77._4_4_ = fStack_7bc;
    auVar77._0_4_ = local_7c0;
    auVar77._8_4_ = fStack_7b8;
    auVar77._12_4_ = aStack_7b4;
    auVar77._16_4_ = fStack_7b0;
    auVar77._20_4_ = fStack_7ac;
    auVar77._24_4_ = fStack_7a8;
    auVar77._28_4_ = fStack_7a4;
    auVar101 = vperm2f128_avx(auVar77,auVar77,1);
    auVar101 = vshufps_avx(auVar101,auVar77,0x30);
    local_960 = vshufps_avx(auVar77,auVar101,0x29);
    local_640 = vsubps_avx(local_960,auVar77);
    auVar22._4_4_ = fVar336 * fVar236;
    auVar22._0_4_ = fVar332 * fVar260;
    auVar22._8_4_ = fVar337 * fVar294;
    auVar22._12_4_ = fVar338 * fVar241;
    auVar22._16_4_ = fVar339 * fVar244;
    auVar22._20_4_ = fVar340 * fVar308;
    auVar22._24_4_ = fVar341 * fVar342;
    auVar22._28_4_ = local_960._28_4_;
    fVar374 = local_640._0_4_;
    fVar376 = local_640._4_4_;
    auVar25._4_4_ = fVar376 * local_900._4_4_;
    auVar25._0_4_ = fVar374 * (float)local_900._0_4_;
    fVar377 = local_640._8_4_;
    auVar25._8_4_ = fVar377 * local_900._8_4_;
    fVar378 = local_640._12_4_;
    auVar25._12_4_ = fVar378 * local_900._12_4_;
    fVar379 = local_640._16_4_;
    auVar25._16_4_ = fVar379 * local_900._16_4_;
    fVar380 = local_640._20_4_;
    auVar25._20_4_ = fVar380 * local_900._20_4_;
    fVar381 = local_640._24_4_;
    auVar25._24_4_ = fVar381 * local_900._24_4_;
    auVar25._28_4_ = auVar21._28_4_;
    auVar191 = vsubps_avx(auVar25,auVar22);
    auVar26._4_4_ = fVar325 * fVar376;
    auVar26._0_4_ = fVar317 * fVar374;
    auVar26._8_4_ = fVar326 * fVar377;
    auVar26._12_4_ = fVar327 * fVar378;
    auVar26._16_4_ = fVar328 * fVar379;
    auVar26._20_4_ = fVar329 * fVar380;
    auVar26._24_4_ = fVar330 * fVar381;
    auVar26._28_4_ = auVar21._28_4_;
    auVar27._4_4_ = fVar336 * fVar219;
    auVar27._0_4_ = fVar332 * fVar257;
    auVar27._8_4_ = fVar337 * fVar293;
    auVar27._12_4_ = fVar338 * fVar239;
    auVar27._16_4_ = fVar339 * fVar243;
    auVar27._20_4_ = fVar340 * fVar306;
    auVar27._24_4_ = fVar341 * fVar331;
    auVar27._28_4_ = fVar343;
    auVar23 = vsubps_avx(auVar27,auVar26);
    fVar245 = auVar23._28_4_;
    auVar209._0_4_ = fVar374 * fVar374 + fVar257 * fVar257 + fVar260 * fVar260;
    auVar209._4_4_ = fVar376 * fVar376 + fVar219 * fVar219 + fVar236 * fVar236;
    auVar209._8_4_ = fVar377 * fVar377 + fVar293 * fVar293 + fVar294 * fVar294;
    auVar209._12_4_ = fVar378 * fVar378 + fVar239 * fVar239 + fVar241 * fVar241;
    auVar209._16_4_ = fVar379 * fVar379 + fVar243 * fVar243 + fVar244 * fVar244;
    auVar209._20_4_ = fVar380 * fVar380 + fVar306 * fVar306 + fVar308 * fVar308;
    auVar209._24_4_ = fVar381 * fVar381 + fVar331 * fVar331 + fVar342 * fVar342;
    auVar209._28_4_ = fVar245 + fVar245 + auVar191._28_4_ + fVar245;
    auVar101 = vrcpps_avx(auVar209);
    fVar142 = auVar101._0_4_;
    fVar145 = auVar101._4_4_;
    auVar28._4_4_ = fVar145 * auVar209._4_4_;
    auVar28._0_4_ = fVar142 * auVar209._0_4_;
    fVar148 = auVar101._8_4_;
    auVar28._8_4_ = fVar148 * auVar209._8_4_;
    fVar281 = auVar101._12_4_;
    auVar28._12_4_ = fVar281 * auVar209._12_4_;
    fVar216 = auVar101._16_4_;
    auVar28._16_4_ = fVar216 * auVar209._16_4_;
    fVar237 = auVar101._20_4_;
    auVar28._20_4_ = fVar237 * auVar209._20_4_;
    fVar242 = auVar101._24_4_;
    auVar28._24_4_ = fVar242 * auVar209._24_4_;
    auVar28._28_4_ = fVar343;
    auVar127._8_4_ = 0x3f800000;
    auVar127._0_8_ = 0x3f8000003f800000;
    auVar127._12_4_ = 0x3f800000;
    auVar127._16_4_ = 0x3f800000;
    auVar127._20_4_ = 0x3f800000;
    auVar127._24_4_ = 0x3f800000;
    auVar127._28_4_ = 0x3f800000;
    auVar190 = vsubps_avx(auVar127,auVar28);
    fVar142 = auVar190._0_4_ * fVar142 + fVar142;
    fVar145 = auVar190._4_4_ * fVar145 + fVar145;
    fVar148 = auVar190._8_4_ * fVar148 + fVar148;
    fVar281 = auVar190._12_4_ * fVar281 + fVar281;
    fVar216 = auVar190._16_4_ * fVar216 + fVar216;
    fVar237 = auVar190._20_4_ * fVar237 + fVar237;
    fVar242 = auVar190._24_4_ * fVar242 + fVar242;
    auVar102 = vperm2f128_avx(auVar24,auVar24,1);
    auVar102 = vshufps_avx(auVar102,auVar24,0x30);
    local_820 = vshufps_avx(auVar24,auVar102,0x29);
    auVar102 = vperm2f128_avx(local_900,local_900,1);
    auVar102 = vshufps_avx(auVar102,local_900,0x30);
    local_840 = vshufps_avx(local_900,auVar102,0x29);
    fVar371 = local_840._0_4_;
    fVar372 = local_840._4_4_;
    auVar29._4_4_ = fVar372 * fVar219;
    auVar29._0_4_ = fVar371 * fVar257;
    fVar139 = local_840._8_4_;
    auVar29._8_4_ = fVar139 * fVar293;
    fVar143 = local_840._12_4_;
    auVar29._12_4_ = fVar143 * fVar239;
    fVar146 = local_840._16_4_;
    auVar29._16_4_ = fVar146 * fVar243;
    fVar149 = local_840._20_4_;
    auVar29._20_4_ = fVar149 * fVar306;
    fVar151 = local_840._24_4_;
    auVar29._24_4_ = fVar151 * fVar331;
    auVar29._28_4_ = auVar102._28_4_;
    fVar344 = local_820._0_4_;
    fVar350 = local_820._4_4_;
    auVar30._4_4_ = fVar350 * fVar236;
    auVar30._0_4_ = fVar344 * fVar260;
    fVar352 = local_820._8_4_;
    auVar30._8_4_ = fVar352 * fVar294;
    fVar354 = local_820._12_4_;
    auVar30._12_4_ = fVar354 * fVar241;
    fVar356 = local_820._16_4_;
    auVar30._16_4_ = fVar356 * fVar244;
    fVar358 = local_820._20_4_;
    auVar30._20_4_ = fVar358 * fVar308;
    fVar360 = local_820._24_4_;
    auVar30._24_4_ = fVar360 * fVar342;
    auVar30._28_4_ = fVar349;
    auVar24 = vsubps_avx(auVar30,auVar29);
    auVar102 = vperm2f128_avx(auVar285,auVar285,1);
    auVar102 = vshufps_avx(auVar102,auVar285,0x30);
    local_980 = vshufps_avx(auVar285,auVar102,0x29);
    fVar357 = local_980._0_4_;
    fVar359 = local_980._4_4_;
    auVar31._4_4_ = fVar359 * fVar236;
    auVar31._0_4_ = fVar357 * fVar260;
    fVar361 = local_980._8_4_;
    auVar31._8_4_ = fVar361 * fVar294;
    fVar367 = local_980._12_4_;
    auVar31._12_4_ = fVar367 * fVar241;
    fVar368 = local_980._16_4_;
    auVar31._16_4_ = fVar368 * fVar244;
    fVar369 = local_980._20_4_;
    auVar31._20_4_ = fVar369 * fVar308;
    fVar370 = local_980._24_4_;
    auVar31._24_4_ = fVar370 * fVar342;
    auVar31._28_4_ = auVar102._28_4_;
    auVar32._4_4_ = fVar376 * fVar372;
    auVar32._0_4_ = fVar374 * fVar371;
    auVar32._8_4_ = fVar377 * fVar139;
    auVar32._12_4_ = fVar378 * fVar143;
    auVar32._16_4_ = fVar379 * fVar146;
    auVar32._20_4_ = fVar380 * fVar149;
    auVar32._24_4_ = fVar381 * fVar151;
    auVar32._28_4_ = uStack_1c4;
    auVar102 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ = fVar350 * fVar376;
    auVar33._0_4_ = fVar344 * fVar374;
    auVar33._8_4_ = fVar352 * fVar377;
    auVar33._12_4_ = fVar354 * fVar378;
    auVar33._16_4_ = fVar356 * fVar379;
    auVar33._20_4_ = fVar358 * fVar380;
    auVar33._24_4_ = fVar360 * fVar381;
    auVar33._28_4_ = uStack_1c4;
    auVar34._4_4_ = fVar359 * fVar219;
    auVar34._0_4_ = fVar357 * fVar257;
    auVar34._8_4_ = fVar361 * fVar293;
    auVar34._12_4_ = fVar367 * fVar239;
    auVar34._16_4_ = fVar368 * fVar243;
    auVar34._20_4_ = fVar369 * fVar306;
    auVar34._24_4_ = fVar370 * fVar331;
    auVar34._28_4_ = local_820._28_4_;
    auVar285 = vsubps_avx(auVar34,auVar33);
    fVar245 = auVar285._28_4_;
    fVar355 = auVar102._28_4_ + fVar245;
    auVar35._4_4_ =
         (auVar130._4_4_ * auVar130._4_4_ +
         auVar191._4_4_ * auVar191._4_4_ + auVar23._4_4_ * auVar23._4_4_) * fVar145;
    auVar35._0_4_ =
         (auVar130._0_4_ * auVar130._0_4_ +
         auVar191._0_4_ * auVar191._0_4_ + auVar23._0_4_ * auVar23._0_4_) * fVar142;
    auVar35._8_4_ =
         (auVar130._8_4_ * auVar130._8_4_ +
         auVar191._8_4_ * auVar191._8_4_ + auVar23._8_4_ * auVar23._8_4_) * fVar148;
    auVar35._12_4_ =
         (auVar130._12_4_ * auVar130._12_4_ +
         auVar191._12_4_ * auVar191._12_4_ + auVar23._12_4_ * auVar23._12_4_) * fVar281;
    auVar35._16_4_ =
         (auVar130._16_4_ * auVar130._16_4_ +
         auVar191._16_4_ * auVar191._16_4_ + auVar23._16_4_ * auVar23._16_4_) * fVar216;
    auVar35._20_4_ =
         (auVar130._20_4_ * auVar130._20_4_ +
         auVar191._20_4_ * auVar191._20_4_ + auVar23._20_4_ * auVar23._20_4_) * fVar237;
    auVar35._24_4_ =
         (auVar130._24_4_ * auVar130._24_4_ +
         auVar191._24_4_ * auVar191._24_4_ + auVar23._24_4_ * auVar23._24_4_) * fVar242;
    auVar35._28_4_ = local_840._28_4_;
    auVar36._4_4_ =
         (auVar24._4_4_ * auVar24._4_4_ +
         auVar102._4_4_ * auVar102._4_4_ + auVar285._4_4_ * auVar285._4_4_) * fVar145;
    auVar36._0_4_ =
         (auVar24._0_4_ * auVar24._0_4_ +
         auVar102._0_4_ * auVar102._0_4_ + auVar285._0_4_ * auVar285._0_4_) * fVar142;
    auVar36._8_4_ =
         (auVar24._8_4_ * auVar24._8_4_ +
         auVar102._8_4_ * auVar102._8_4_ + auVar285._8_4_ * auVar285._8_4_) * fVar148;
    auVar36._12_4_ =
         (auVar24._12_4_ * auVar24._12_4_ +
         auVar102._12_4_ * auVar102._12_4_ + auVar285._12_4_ * auVar285._12_4_) * fVar281;
    auVar36._16_4_ =
         (auVar24._16_4_ * auVar24._16_4_ +
         auVar102._16_4_ * auVar102._16_4_ + auVar285._16_4_ * auVar285._16_4_) * fVar216;
    auVar36._20_4_ =
         (auVar24._20_4_ * auVar24._20_4_ +
         auVar102._20_4_ * auVar102._20_4_ + auVar285._20_4_ * auVar285._20_4_) * fVar237;
    auVar36._24_4_ =
         (auVar24._24_4_ * auVar24._24_4_ +
         auVar102._24_4_ * auVar102._24_4_ + auVar285._24_4_ * auVar285._24_4_) * fVar242;
    auVar36._28_4_ = auVar190._28_4_ + auVar101._28_4_;
    auVar101 = vmaxps_avx(auVar35,auVar36);
    auVar102 = vperm2f128_avx(local_6c0,local_6c0,1);
    auVar102 = vshufps_avx(auVar102,local_6c0,0x30);
    _local_720 = vshufps_avx(local_6c0,auVar102,0x29);
    local_740._0_4_ = (float)local_6c0._0_4_ + fVar220;
    local_740._4_4_ = local_6c0._4_4_ + fVar238;
    fStack_738 = local_6c0._8_4_ + fVar240;
    fStack_734 = local_6c0._12_4_ + fVar217;
    fStack_730 = local_6c0._16_4_ + fVar218;
    fStack_72c = local_6c0._20_4_ + fVar280;
    fStack_728 = local_6c0._24_4_ + fVar295;
    fStack_724 = local_6c0._28_4_ + fVar304;
    auVar102 = vmaxps_avx(local_6c0,_local_740);
    auVar130 = vmaxps_avx(local_6e0,_local_720);
    auVar102 = vmaxps_avx(auVar102,auVar130);
    auVar130 = vrsqrtps_avx(auVar209);
    fVar142 = auVar130._0_4_;
    fVar145 = auVar130._4_4_;
    fVar148 = auVar130._8_4_;
    fVar238 = auVar130._12_4_;
    fVar240 = auVar130._16_4_;
    fVar281 = auVar130._20_4_;
    fVar216 = auVar130._24_4_;
    auVar37._4_4_ = fVar145 * fVar145 * fVar145 * auVar209._4_4_ * 0.5;
    auVar37._0_4_ = fVar142 * fVar142 * fVar142 * auVar209._0_4_ * 0.5;
    auVar37._8_4_ = fVar148 * fVar148 * fVar148 * auVar209._8_4_ * 0.5;
    auVar37._12_4_ = fVar238 * fVar238 * fVar238 * auVar209._12_4_ * 0.5;
    auVar37._16_4_ = fVar240 * fVar240 * fVar240 * auVar209._16_4_ * 0.5;
    auVar37._20_4_ = fVar281 * fVar281 * fVar281 * auVar209._20_4_ * 0.5;
    auVar37._24_4_ = fVar216 * fVar216 * fVar216 * auVar209._24_4_ * 0.5;
    auVar37._28_4_ = auVar209._28_4_;
    auVar38._4_4_ = fVar145 * 1.5;
    auVar38._0_4_ = fVar142 * 1.5;
    auVar38._8_4_ = fVar148 * 1.5;
    auVar38._12_4_ = fVar238 * 1.5;
    auVar38._16_4_ = fVar240 * 1.5;
    auVar38._20_4_ = fVar281 * 1.5;
    auVar38._24_4_ = fVar216 * 1.5;
    auVar38._28_4_ = auVar130._28_4_;
    local_320 = vsubps_avx(auVar38,auVar37);
    auVar73._4_4_ = fVar305;
    auVar73._0_4_ = fVar296;
    auVar73._8_4_ = fVar307;
    auVar73._12_4_ = fVar309;
    auVar73._16_4_ = fVar311;
    auVar73._20_4_ = fVar313;
    auVar73._24_4_ = fVar315;
    auVar73._28_4_ = fVar316;
    auVar130 = vsubps_avx(ZEXT832(0) << 0x20,auVar73);
    auVar191 = vsubps_avx(ZEXT832(0) << 0x20,auVar74);
    fVar142 = auVar191._0_4_;
    fVar238 = auVar191._4_4_;
    fVar216 = auVar191._8_4_;
    fVar217 = auVar191._12_4_;
    fVar280 = auVar191._16_4_;
    fVar310 = auVar191._20_4_;
    fVar343 = auVar191._24_4_;
    fVar353 = local_320._28_4_;
    fVar145 = auVar130._0_4_;
    fVar240 = auVar130._4_4_;
    fVar220 = auVar130._8_4_;
    fVar242 = auVar130._12_4_;
    fVar295 = auVar130._16_4_;
    fVar312 = auVar130._20_4_;
    fVar349 = auVar130._24_4_;
    auVar285 = ZEXT832(0) << 0x20;
    auVar130 = vsubps_avx(auVar285,auVar77);
    fVar148 = auVar130._0_4_;
    fVar281 = auVar130._4_4_;
    fVar237 = auVar130._8_4_;
    fVar218 = auVar130._12_4_;
    fVar304 = auVar130._16_4_;
    fVar314 = auVar130._20_4_;
    fVar351 = auVar130._24_4_;
    auVar302._0_4_ = local_5c0 * fVar148 + local_700 * fVar145 + local_5a0 * fVar142;
    auVar302._4_4_ = fStack_5bc * fVar281 + fStack_6fc * fVar240 + fStack_59c * fVar238;
    auVar302._8_4_ = fStack_5b8 * fVar237 + fStack_6f8 * fVar220 + fStack_598 * fVar216;
    auVar302._12_4_ = fStack_5b4 * fVar218 + fStack_6f4 * fVar242 + fStack_594 * fVar217;
    auVar302._16_4_ = fStack_5b0 * fVar304 + fStack_6f0 * fVar295 + fStack_590 * fVar280;
    auVar302._20_4_ = fStack_5ac * fVar314 + fStack_6ec * fVar312 + fStack_58c * fVar310;
    auVar302._24_4_ = fStack_5a8 * fVar351 + fStack_6e8 * fVar349 + fStack_588 * fVar343;
    auVar302._28_4_ = fVar355 + auVar24._28_4_ + fVar355 + fVar353;
    auVar320._0_4_ = fVar148 * fVar148 + fVar145 * fVar145 + fVar142 * fVar142;
    auVar320._4_4_ = fVar281 * fVar281 + fVar240 * fVar240 + fVar238 * fVar238;
    auVar320._8_4_ = fVar237 * fVar237 + fVar220 * fVar220 + fVar216 * fVar216;
    auVar320._12_4_ = fVar218 * fVar218 + fVar242 * fVar242 + fVar217 * fVar217;
    auVar320._16_4_ = fVar304 * fVar304 + fVar295 * fVar295 + fVar280 * fVar280;
    auVar320._20_4_ = fVar314 * fVar314 + fVar312 * fVar312 + fVar310 * fVar310;
    auVar320._24_4_ = fVar351 * fVar351 + fVar349 * fVar349 + fVar343 * fVar343;
    auVar320._28_4_ = fVar245 + fVar245 + fVar355;
    fVar247 = local_320._0_4_;
    fVar256 = local_320._4_4_;
    fVar259 = local_320._8_4_;
    fVar262 = local_320._12_4_;
    fVar264 = local_320._16_4_;
    fVar266 = local_320._20_4_;
    fVar268 = local_320._24_4_;
    fVar355 = local_760._28_4_;
    local_4c0 = local_5c0 * fVar374 * fVar247 +
                fVar247 * fVar257 * local_700 + fVar247 * fVar260 * local_5a0;
    fStack_4bc = fStack_5bc * fVar376 * fVar256 +
                 fVar256 * fVar219 * fStack_6fc + fVar256 * fVar236 * fStack_59c;
    fStack_4b8 = fStack_5b8 * fVar377 * fVar259 +
                 fVar259 * fVar293 * fStack_6f8 + fVar259 * fVar294 * fStack_598;
    fStack_4b4 = fStack_5b4 * fVar378 * fVar262 +
                 fVar262 * fVar239 * fStack_6f4 + fVar262 * fVar241 * fStack_594;
    fStack_4b0 = fStack_5b0 * fVar379 * fVar264 +
                 fVar264 * fVar243 * fStack_6f0 + fVar264 * fVar244 * fStack_590;
    fStack_4ac = fStack_5ac * fVar380 * fVar266 +
                 fVar266 * fVar306 * fStack_6ec + fVar266 * fVar308 * fStack_58c;
    fStack_4a8 = fStack_5a8 * fVar381 * fVar268 +
                 fVar268 * fVar331 * fStack_6e8 + fVar268 * fVar342 * fStack_588;
    fVar245 = local_620._28_4_ + fVar355 + fStack_584;
    local_4e0 = fVar148 * fVar374 * fVar247 +
                fVar145 * fVar247 * fVar257 + fVar247 * fVar260 * fVar142;
    fStack_4dc = fVar281 * fVar376 * fVar256 +
                 fVar240 * fVar256 * fVar219 + fVar256 * fVar236 * fVar238;
    fStack_4d8 = fVar237 * fVar377 * fVar259 +
                 fVar220 * fVar259 * fVar293 + fVar259 * fVar294 * fVar216;
    fStack_4d4 = fVar218 * fVar378 * fVar262 +
                 fVar242 * fVar262 * fVar239 + fVar262 * fVar241 * fVar217;
    fStack_4d0 = fVar304 * fVar379 * fVar264 +
                 fVar295 * fVar264 * fVar243 + fVar264 * fVar244 * fVar280;
    fStack_4cc = fVar314 * fVar380 * fVar266 +
                 fVar312 * fVar266 * fVar306 + fVar266 * fVar308 * fVar310;
    fStack_4c8 = fVar351 * fVar381 * fVar268 +
                 fVar349 * fVar268 * fVar331 + fVar268 * fVar342 * fVar343;
    fStack_4c4 = fVar355 + fVar245;
    auVar39._4_4_ = fStack_4bc * fStack_4dc;
    auVar39._0_4_ = local_4c0 * local_4e0;
    auVar39._8_4_ = fStack_4b8 * fStack_4d8;
    auVar39._12_4_ = fStack_4b4 * fStack_4d4;
    auVar39._16_4_ = fStack_4b0 * fStack_4d0;
    auVar39._20_4_ = fStack_4ac * fStack_4cc;
    auVar39._24_4_ = fStack_4a8 * fStack_4c8;
    auVar39._28_4_ = fVar245;
    auVar23 = vsubps_avx(auVar302,auVar39);
    auVar40._4_4_ = fStack_4dc * fStack_4dc;
    auVar40._0_4_ = local_4e0 * local_4e0;
    auVar40._8_4_ = fStack_4d8 * fStack_4d8;
    auVar40._12_4_ = fStack_4d4 * fStack_4d4;
    auVar40._16_4_ = fStack_4d0 * fStack_4d0;
    auVar40._20_4_ = fStack_4cc * fStack_4cc;
    auVar40._24_4_ = fStack_4c8 * fStack_4c8;
    auVar40._28_4_ = fVar355;
    _local_9e0 = vsubps_avx(auVar320,auVar40);
    local_600 = vsqrtps_avx(auVar101);
    fVar245 = (local_600._0_4_ + auVar102._0_4_) * 1.0000002;
    fVar138 = (local_600._4_4_ + auVar102._4_4_) * 1.0000002;
    fVar140 = (local_600._8_4_ + auVar102._8_4_) * 1.0000002;
    fVar144 = (local_600._12_4_ + auVar102._12_4_) * 1.0000002;
    fVar147 = (local_600._16_4_ + auVar102._16_4_) * 1.0000002;
    fVar150 = (local_600._20_4_ + auVar102._20_4_) * 1.0000002;
    fVar152 = (local_600._24_4_ + auVar102._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar138 * fVar138;
    auVar41._0_4_ = fVar245 * fVar245;
    auVar41._8_4_ = fVar140 * fVar140;
    auVar41._12_4_ = fVar144 * fVar144;
    auVar41._16_4_ = fVar147 * fVar147;
    auVar41._20_4_ = fVar150 * fVar150;
    auVar41._24_4_ = fVar152 * fVar152;
    auVar41._28_4_ = local_600._28_4_ + auVar102._28_4_;
    local_660._0_4_ = auVar23._0_4_ + auVar23._0_4_;
    local_660._4_4_ = auVar23._4_4_ + auVar23._4_4_;
    local_660._8_4_ = auVar23._8_4_ + auVar23._8_4_;
    local_660._12_4_ = auVar23._12_4_ + auVar23._12_4_;
    local_660._16_4_ = auVar23._16_4_ + auVar23._16_4_;
    local_660._20_4_ = auVar23._20_4_ + auVar23._20_4_;
    local_660._24_4_ = auVar23._24_4_ + auVar23._24_4_;
    fVar245 = auVar23._28_4_;
    local_660._28_4_ = fVar245 + fVar245;
    auVar102 = vsubps_avx(_local_9e0,auVar41);
    auVar42._4_4_ = fStack_4bc * fStack_4bc;
    auVar42._0_4_ = local_4c0 * local_4c0;
    auVar42._8_4_ = fStack_4b8 * fStack_4b8;
    auVar42._12_4_ = fStack_4b4 * fStack_4b4;
    auVar42._16_4_ = fStack_4b0 * fStack_4b0;
    auVar42._20_4_ = fStack_4ac * fStack_4ac;
    auVar42._24_4_ = fStack_4a8 * fStack_4a8;
    auVar42._28_4_ = fVar245;
    auVar324 = ZEXT3264(local_240);
    auVar23 = vsubps_avx(local_240,auVar42);
    local_800._4_4_ = local_660._4_4_ * local_660._4_4_;
    local_800._0_4_ = local_660._0_4_ * local_660._0_4_;
    local_800._8_4_ = local_660._8_4_ * local_660._8_4_;
    local_800._12_4_ = local_660._12_4_ * local_660._12_4_;
    local_800._16_4_ = local_660._16_4_ * local_660._16_4_;
    local_800._20_4_ = local_660._20_4_ * local_660._20_4_;
    local_800._24_4_ = local_660._24_4_ * local_660._24_4_;
    local_800._28_4_ = 0x3f800002;
    fVar245 = auVar23._0_4_;
    local_5e0._0_4_ = fVar245 * 4.0;
    fVar138 = auVar23._4_4_;
    local_5e0._4_4_ = fVar138 * 4.0;
    fVar140 = auVar23._8_4_;
    fStack_5d8 = fVar140 * 4.0;
    fVar144 = auVar23._12_4_;
    fStack_5d4 = fVar144 * 4.0;
    fVar147 = auVar23._16_4_;
    fStack_5d0 = fVar147 * 4.0;
    fVar150 = auVar23._20_4_;
    fStack_5cc = fVar150 * 4.0;
    fVar152 = auVar23._24_4_;
    fStack_5c8 = fVar152 * 4.0;
    uStack_5c4 = 0x40800000;
    auVar43._4_4_ = auVar102._4_4_ * (float)local_5e0._4_4_;
    auVar43._0_4_ = auVar102._0_4_ * (float)local_5e0._0_4_;
    auVar43._8_4_ = auVar102._8_4_ * fStack_5d8;
    auVar43._12_4_ = auVar102._12_4_ * fStack_5d4;
    auVar43._16_4_ = auVar102._16_4_ * fStack_5d0;
    auVar43._20_4_ = auVar102._20_4_ * fStack_5cc;
    auVar43._24_4_ = auVar102._24_4_ * fStack_5c8;
    auVar43._28_4_ = 0x40800000;
    auVar190 = vsubps_avx(local_800,auVar43);
    auVar101 = vcmpps_avx(auVar190,auVar285,5);
    auVar277._8_4_ = 0x7fffffff;
    auVar277._0_8_ = 0x7fffffff7fffffff;
    auVar277._12_4_ = 0x7fffffff;
    auVar277._16_4_ = 0x7fffffff;
    auVar277._20_4_ = 0x7fffffff;
    auVar277._24_4_ = 0x7fffffff;
    auVar277._28_4_ = 0x7fffffff;
    local_340 = vandps_avx(auVar42,auVar277);
    local_2a0._0_4_ = fVar245 + fVar245;
    local_2a0._4_4_ = fVar138 + fVar138;
    local_2a0._8_4_ = fVar140 + fVar140;
    local_2a0._12_4_ = fVar144 + fVar144;
    local_2a0._16_4_ = fVar147 + fVar147;
    local_2a0._20_4_ = fVar150 + fVar150;
    local_2a0._24_4_ = fVar152 + fVar152;
    local_2a0._28_4_ = auVar23._28_4_ + auVar23._28_4_;
    local_9c0 = vandps_avx(auVar23,auVar277);
    uVar71 = CONCAT44(local_660._4_4_,local_660._0_4_);
    local_280._0_8_ = uVar71 ^ 0x8000000080000000;
    local_280._8_4_ = -local_660._8_4_;
    local_280._12_4_ = -local_660._12_4_;
    local_280._16_4_ = -local_660._16_4_;
    local_280._20_4_ = -local_660._20_4_;
    local_280._24_4_ = -local_660._24_4_;
    local_280._28_4_ = -local_660._28_4_;
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      auVar303._8_4_ = 0x7f800000;
      auVar303._0_8_ = 0x7f8000007f800000;
      auVar303._12_4_ = 0x7f800000;
      auVar303._16_4_ = 0x7f800000;
      auVar303._20_4_ = 0x7f800000;
      auVar303._24_4_ = 0x7f800000;
      auVar303._28_4_ = 0x7f800000;
      auVar128._8_4_ = 0xff800000;
      auVar128._0_8_ = 0xff800000ff800000;
      auVar128._12_4_ = 0xff800000;
      auVar128._16_4_ = 0xff800000;
      auVar128._20_4_ = 0xff800000;
      auVar128._24_4_ = 0xff800000;
      auVar128._28_4_ = 0xff800000;
    }
    else {
      auVar22 = vsqrtps_avx(auVar190);
      auVar24 = vrcpps_avx(local_2a0);
      auVar23 = vcmpps_avx(auVar190,auVar285,5);
      fVar245 = auVar24._0_4_;
      fVar138 = auVar24._4_4_;
      auVar44._4_4_ = local_2a0._4_4_ * fVar138;
      auVar44._0_4_ = local_2a0._0_4_ * fVar245;
      fVar140 = auVar24._8_4_;
      auVar44._8_4_ = local_2a0._8_4_ * fVar140;
      fVar144 = auVar24._12_4_;
      auVar44._12_4_ = local_2a0._12_4_ * fVar144;
      fVar147 = auVar24._16_4_;
      auVar44._16_4_ = local_2a0._16_4_ * fVar147;
      fVar150 = auVar24._20_4_;
      auVar44._20_4_ = local_2a0._20_4_ * fVar150;
      fVar152 = auVar24._24_4_;
      auVar44._24_4_ = local_2a0._24_4_ * fVar152;
      auVar44._28_4_ = auVar190._28_4_;
      auVar286._8_4_ = 0x3f800000;
      auVar286._0_8_ = 0x3f8000003f800000;
      auVar286._12_4_ = 0x3f800000;
      auVar286._16_4_ = 0x3f800000;
      auVar286._20_4_ = 0x3f800000;
      auVar286._24_4_ = 0x3f800000;
      auVar286._28_4_ = 0x3f800000;
      auVar190 = vsubps_avx(auVar286,auVar44);
      fVar245 = fVar245 + fVar245 * auVar190._0_4_;
      fVar138 = fVar138 + fVar138 * auVar190._4_4_;
      fVar140 = fVar140 + fVar140 * auVar190._8_4_;
      fVar144 = fVar144 + fVar144 * auVar190._12_4_;
      fVar147 = fVar147 + fVar147 * auVar190._16_4_;
      fVar150 = fVar150 + fVar150 * auVar190._20_4_;
      fVar152 = fVar152 + fVar152 * auVar190._24_4_;
      auVar285 = vsubps_avx(local_280,auVar22);
      fVar246 = auVar285._0_4_ * fVar245;
      fVar255 = auVar285._4_4_ * fVar138;
      auVar45._4_4_ = fVar255;
      auVar45._0_4_ = fVar246;
      fVar258 = auVar285._8_4_ * fVar140;
      auVar45._8_4_ = fVar258;
      fVar261 = auVar285._12_4_ * fVar144;
      auVar45._12_4_ = fVar261;
      fVar263 = auVar285._16_4_ * fVar147;
      auVar45._16_4_ = fVar263;
      fVar265 = auVar285._20_4_ * fVar150;
      auVar45._20_4_ = fVar265;
      fVar267 = auVar285._24_4_ * fVar152;
      auVar45._24_4_ = fVar267;
      auVar45._28_4_ = auVar285._28_4_;
      auVar285 = vsubps_avx(auVar22,local_660);
      fVar245 = auVar285._0_4_ * fVar245;
      fVar138 = auVar285._4_4_ * fVar138;
      auVar46._4_4_ = fVar138;
      auVar46._0_4_ = fVar245;
      fVar140 = auVar285._8_4_ * fVar140;
      auVar46._8_4_ = fVar140;
      fVar144 = auVar285._12_4_ * fVar144;
      auVar46._12_4_ = fVar144;
      fVar147 = auVar285._16_4_ * fVar147;
      auVar46._16_4_ = fVar147;
      fVar150 = auVar285._20_4_ * fVar150;
      auVar46._20_4_ = fVar150;
      fVar152 = auVar285._24_4_ * fVar152;
      auVar46._24_4_ = fVar152;
      auVar46._28_4_ = auVar24._28_4_ + auVar190._28_4_;
      fStack_2e4 = fStack_4c4 + auVar285._28_4_;
      local_300 = fVar247 * (local_4e0 + local_4c0 * fVar246);
      fStack_2fc = fVar256 * (fStack_4dc + fStack_4bc * fVar255);
      fStack_2f8 = fVar259 * (fStack_4d8 + fStack_4b8 * fVar258);
      fStack_2f4 = fVar262 * (fStack_4d4 + fStack_4b4 * fVar261);
      fStack_2f0 = fVar264 * (fStack_4d0 + fStack_4b0 * fVar263);
      fStack_2ec = fVar266 * (fStack_4cc + fStack_4ac * fVar265);
      fStack_2e8 = fVar268 * (fStack_4c8 + fStack_4a8 * fVar267);
      local_2e0 = fVar247 * (local_4e0 + local_4c0 * fVar245);
      fStack_2dc = fVar256 * (fStack_4dc + fStack_4bc * fVar138);
      fStack_2d8 = fVar259 * (fStack_4d8 + fStack_4b8 * fVar140);
      fStack_2d4 = fVar262 * (fStack_4d4 + fStack_4b4 * fVar144);
      fStack_2d0 = fVar264 * (fStack_4d0 + fStack_4b0 * fVar147);
      fStack_2cc = fVar266 * (fStack_4cc + fStack_4ac * fVar150);
      fStack_2c8 = fVar268 * (fStack_4c8 + fStack_4a8 * fVar152);
      fStack_2c4 = fStack_4c4 + fStack_2e4;
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar303 = vblendvps_avx(auVar228,auVar45,auVar23);
      auVar229._8_4_ = 0xff800000;
      auVar229._0_8_ = 0xff800000ff800000;
      auVar229._12_4_ = 0xff800000;
      auVar229._16_4_ = 0xff800000;
      auVar229._20_4_ = 0xff800000;
      auVar229._24_4_ = 0xff800000;
      auVar229._28_4_ = 0xff800000;
      auVar128 = vblendvps_avx(auVar229,auVar46,auVar23);
      auVar190 = vmaxps_avx(local_4a0,local_340);
      auVar47._4_4_ = auVar190._4_4_ * 1.9073486e-06;
      auVar47._0_4_ = auVar190._0_4_ * 1.9073486e-06;
      auVar47._8_4_ = auVar190._8_4_ * 1.9073486e-06;
      auVar47._12_4_ = auVar190._12_4_ * 1.9073486e-06;
      auVar47._16_4_ = auVar190._16_4_ * 1.9073486e-06;
      auVar47._20_4_ = auVar190._20_4_ * 1.9073486e-06;
      auVar47._24_4_ = auVar190._24_4_ * 1.9073486e-06;
      auVar47._28_4_ = auVar190._28_4_;
      auVar190 = vcmpps_avx(local_9c0,auVar47,1);
      auVar324 = ZEXT3264(auVar190);
      auVar24 = auVar23 & auVar190;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar101 = vandps_avx(auVar190,auVar23);
        auVar181 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar190 = vcmpps_avx(auVar102,_DAT_01f7b000,2);
        auVar323._8_4_ = 0xff800000;
        auVar323._0_8_ = 0xff800000ff800000;
        auVar323._12_4_ = 0xff800000;
        auVar323._16_4_ = 0xff800000;
        auVar323._20_4_ = 0xff800000;
        auVar323._24_4_ = 0xff800000;
        auVar323._28_4_ = 0xff800000;
        auVar335._8_4_ = 0x7f800000;
        auVar335._0_8_ = 0x7f8000007f800000;
        auVar335._12_4_ = 0x7f800000;
        auVar335._16_4_ = 0x7f800000;
        auVar335._20_4_ = 0x7f800000;
        auVar335._24_4_ = 0x7f800000;
        auVar335._28_4_ = 0x7f800000;
        auVar102 = vblendvps_avx(auVar335,auVar323,auVar190);
        auVar178 = vpmovsxwd_avx(auVar181);
        auVar324 = ZEXT1664(auVar178);
        auVar181 = vpunpckhwd_avx(auVar181,auVar181);
        auVar235._16_16_ = auVar181;
        auVar235._0_16_ = auVar178;
        auVar303 = vblendvps_avx(auVar303,auVar102,auVar235);
        auVar279._8_4_ = 0xff800000;
        auVar279._0_8_ = 0xff800000ff800000;
        auVar279._12_4_ = 0xff800000;
        auVar279._16_4_ = 0xff800000;
        auVar279._20_4_ = 0xff800000;
        auVar279._24_4_ = 0xff800000;
        auVar279._28_4_ = 0xff800000;
        auVar102 = vblendvps_avx(auVar279,auVar335,auVar190);
        auVar128 = vblendvps_avx(auVar128,auVar102,auVar235);
        auVar194._0_8_ = auVar101._0_8_ ^ 0xffffffffffffffff;
        auVar194._8_4_ = auVar101._8_4_ ^ 0xffffffff;
        auVar194._12_4_ = auVar101._12_4_ ^ 0xffffffff;
        auVar194._16_4_ = auVar101._16_4_ ^ 0xffffffff;
        auVar194._20_4_ = auVar101._20_4_ ^ 0xffffffff;
        auVar194._24_4_ = auVar101._24_4_ ^ 0xffffffff;
        auVar194._28_4_ = auVar101._28_4_ ^ 0xffffffff;
        auVar101 = vorps_avx(auVar190,auVar194);
        auVar101 = vandps_avx(auVar23,auVar101);
      }
    }
    auVar102 = local_2c0 & auVar101;
    auVar290 = ZEXT3264(CONCAT428(fStack_584,
                                  CONCAT424(fStack_588,
                                            CONCAT420(fStack_58c,
                                                      CONCAT416(fStack_590,
                                                                CONCAT412(fStack_594,
                                                                          CONCAT48(fStack_598,
                                                                                   CONCAT44(
                                                  fStack_59c,local_5a0))))))));
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar102 >> 0x7f,0) == '\0') &&
          (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar102 >> 0xbf,0) == '\0') &&
        (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar102[0x1f])
    {
LAB_009224d1:
      auVar366 = ZEXT3264(_local_8a0);
      auVar348 = ZEXT3264(_local_920);
      local_800._0_8_ = uVar82;
      fVar245 = (float)local_780._0_4_;
      fVar254 = (float)local_780._4_4_;
      fVar257 = fStack_778;
      fVar260 = fStack_774;
      fVar142 = fStack_770;
      fVar145 = fStack_76c;
      fVar148 = fStack_768;
      fVar195 = fStack_764;
    }
    else {
      fStack_4a4 = local_620._28_4_ + fVar355 + fStack_584;
      auVar181 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7a0._0_4_));
      auVar181 = vshufps_avx(auVar181,auVar181,0);
      auVar230._16_16_ = auVar181;
      auVar230._0_16_ = auVar181;
      auVar23 = vmaxps_avx(auVar230,auVar303);
      auVar181 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7a0._0_4_));
      auVar181 = vshufps_avx(auVar181,auVar181,0);
      auVar231._16_16_ = auVar181;
      auVar231._0_16_ = auVar181;
      auVar190 = vminps_avx(auVar231,auVar128);
      fVar152 = auVar191._28_4_ + auVar181._12_4_;
      auVar103._0_4_ =
           local_5c0 * fVar332 + local_700 * fVar317 + local_5a0 * (float)local_900._0_4_;
      auVar103._4_4_ = fStack_5bc * fVar336 + fStack_6fc * fVar325 + fStack_59c * local_900._4_4_;
      auVar103._8_4_ = fStack_5b8 * fVar337 + fStack_6f8 * fVar326 + fStack_598 * local_900._8_4_;
      auVar103._12_4_ = fStack_5b4 * fVar338 + fStack_6f4 * fVar327 + fStack_594 * local_900._12_4_;
      auVar103._16_4_ = fStack_5b0 * fVar339 + fStack_6f0 * fVar328 + fStack_590 * local_900._16_4_;
      auVar103._20_4_ = fStack_5ac * fVar340 + fStack_6ec * fVar329 + fStack_58c * local_900._20_4_;
      auVar103._24_4_ = fStack_5a8 * fVar341 + fStack_6e8 * fVar330 + fStack_588 * local_900._24_4_;
      auVar103._28_4_ = fVar152 + fVar152 + 0.0;
      auVar102 = vrcpps_avx(auVar103);
      fVar245 = auVar102._0_4_;
      fVar355 = auVar102._4_4_;
      auVar48._4_4_ = auVar103._4_4_ * fVar355;
      auVar48._0_4_ = auVar103._0_4_ * fVar245;
      fVar138 = auVar102._8_4_;
      auVar48._8_4_ = auVar103._8_4_ * fVar138;
      fVar140 = auVar102._12_4_;
      auVar48._12_4_ = auVar103._12_4_ * fVar140;
      fVar144 = auVar102._16_4_;
      auVar48._16_4_ = auVar103._16_4_ * fVar144;
      fVar147 = auVar102._20_4_;
      auVar48._20_4_ = auVar103._20_4_ * fVar147;
      fVar150 = auVar102._24_4_;
      auVar48._24_4_ = auVar103._24_4_ * fVar150;
      auVar48._28_4_ = uStack_1c4;
      auVar363._8_4_ = 0x3f800000;
      auVar363._0_8_ = 0x3f8000003f800000;
      auVar363._12_4_ = 0x3f800000;
      auVar363._16_4_ = 0x3f800000;
      auVar363._20_4_ = 0x3f800000;
      auVar363._24_4_ = 0x3f800000;
      auVar363._28_4_ = 0x3f800000;
      auVar191 = vsubps_avx(auVar363,auVar48);
      auVar287._8_4_ = 0x7fffffff;
      auVar287._0_8_ = 0x7fffffff7fffffff;
      auVar287._12_4_ = 0x7fffffff;
      auVar287._16_4_ = 0x7fffffff;
      auVar287._20_4_ = 0x7fffffff;
      auVar287._24_4_ = 0x7fffffff;
      auVar287._28_4_ = 0x7fffffff;
      auVar290 = ZEXT3264(auVar287);
      auVar102 = vandps_avx(auVar287,auVar103);
      auVar375._8_4_ = 0x219392ef;
      auVar375._0_8_ = 0x219392ef219392ef;
      auVar375._12_4_ = 0x219392ef;
      auVar375._16_4_ = 0x219392ef;
      auVar375._20_4_ = 0x219392ef;
      auVar375._24_4_ = 0x219392ef;
      auVar375._28_4_ = 0x219392ef;
      auVar102 = vcmpps_avx(auVar102,auVar375,1);
      auVar49._4_4_ =
           (fVar355 + fVar355 * auVar191._4_4_) *
           -(fVar336 * fVar281 + fVar240 * fVar325 + local_900._4_4_ * fVar238);
      auVar49._0_4_ =
           (fVar245 + fVar245 * auVar191._0_4_) *
           -(fVar332 * fVar148 + fVar145 * fVar317 + (float)local_900._0_4_ * fVar142);
      auVar49._8_4_ =
           (fVar138 + fVar138 * auVar191._8_4_) *
           -(fVar337 * fVar237 + fVar220 * fVar326 + local_900._8_4_ * fVar216);
      auVar49._12_4_ =
           (fVar140 + fVar140 * auVar191._12_4_) *
           -(fVar338 * fVar218 + fVar242 * fVar327 + local_900._12_4_ * fVar217);
      auVar49._16_4_ =
           (fVar144 + fVar144 * auVar191._16_4_) *
           -(fVar339 * fVar304 + fVar295 * fVar328 + local_900._16_4_ * fVar280);
      auVar49._20_4_ =
           (fVar147 + fVar147 * auVar191._20_4_) *
           -(fVar340 * fVar314 + fVar312 * fVar329 + local_900._20_4_ * fVar310);
      auVar49._24_4_ =
           (fVar150 + fVar150 * auVar191._24_4_) *
           -(fVar341 * fVar351 + fVar349 * fVar330 + local_900._24_4_ * fVar343);
      auVar49._28_4_ = -(auVar130._28_4_ + fVar152);
      auVar181 = ZEXT816(0) << 0x40;
      auVar130 = vcmpps_avx(auVar103,ZEXT1632(auVar181),1);
      auVar191 = vorps_avx(auVar102,auVar130);
      auVar130 = vcmpps_avx(auVar103,ZEXT1632(auVar181),6);
      auVar130 = vorps_avx(auVar102,auVar130);
      auVar347._8_4_ = 0xff800000;
      auVar347._0_8_ = 0xff800000ff800000;
      auVar347._12_4_ = 0xff800000;
      auVar347._16_4_ = 0xff800000;
      auVar347._20_4_ = 0xff800000;
      auVar347._24_4_ = 0xff800000;
      auVar347._28_4_ = 0xff800000;
      auVar102 = vblendvps_avx(auVar49,auVar347,auVar191);
      auVar373._8_4_ = 0x7f800000;
      auVar373._0_8_ = 0x7f8000007f800000;
      auVar373._12_4_ = 0x7f800000;
      auVar373._16_4_ = 0x7f800000;
      auVar373._20_4_ = 0x7f800000;
      auVar373._24_4_ = 0x7f800000;
      auVar373._28_4_ = 0x7f800000;
      auVar130 = vblendvps_avx(auVar49,auVar373,auVar130);
      auVar191 = vmaxps_avx(auVar23,auVar102);
      auVar23 = vminps_avx(auVar190,auVar130);
      auVar190 = ZEXT1632(auVar181);
      auVar102 = vsubps_avx(auVar190,auVar21);
      auVar130 = vsubps_avx(auVar190,local_7e0);
      auVar50._4_4_ = auVar130._4_4_ * -fVar372;
      auVar50._0_4_ = auVar130._0_4_ * -fVar371;
      auVar50._8_4_ = auVar130._8_4_ * -fVar139;
      auVar50._12_4_ = auVar130._12_4_ * -fVar143;
      auVar50._16_4_ = auVar130._16_4_ * -fVar146;
      auVar50._20_4_ = auVar130._20_4_ * -fVar149;
      auVar50._24_4_ = auVar130._24_4_ * -fVar151;
      auVar50._28_4_ = auVar130._28_4_;
      auVar51._4_4_ = fVar350 * auVar102._4_4_;
      auVar51._0_4_ = fVar344 * auVar102._0_4_;
      auVar51._8_4_ = fVar352 * auVar102._8_4_;
      auVar51._12_4_ = fVar354 * auVar102._12_4_;
      auVar51._16_4_ = fVar356 * auVar102._16_4_;
      auVar51._20_4_ = fVar358 * auVar102._20_4_;
      auVar51._24_4_ = fVar360 * auVar102._24_4_;
      auVar51._28_4_ = auVar102._28_4_;
      auVar102 = vsubps_avx(auVar50,auVar51);
      auVar130 = vsubps_avx(auVar190,local_960);
      auVar52._4_4_ = fVar359 * auVar130._4_4_;
      auVar52._0_4_ = fVar357 * auVar130._0_4_;
      auVar52._8_4_ = fVar361 * auVar130._8_4_;
      auVar52._12_4_ = fVar367 * auVar130._12_4_;
      auVar52._16_4_ = fVar368 * auVar130._16_4_;
      auVar52._20_4_ = fVar369 * auVar130._20_4_;
      uVar89 = auVar130._28_4_;
      auVar52._24_4_ = fVar370 * auVar130._24_4_;
      auVar52._28_4_ = uVar89;
      auVar21 = vsubps_avx(auVar102,auVar52);
      auVar53._4_4_ = fStack_59c * -fVar372;
      auVar53._0_4_ = local_5a0 * -fVar371;
      auVar53._8_4_ = fStack_598 * -fVar139;
      auVar53._12_4_ = fStack_594 * -fVar143;
      auVar53._16_4_ = fStack_590 * -fVar146;
      auVar53._20_4_ = fStack_58c * -fVar149;
      auVar53._24_4_ = fStack_588 * -fVar151;
      auVar53._28_4_ = local_840._28_4_ ^ 0x80000000;
      auVar364._8_4_ = 0x3f800000;
      auVar364._0_8_ = 0x3f8000003f800000;
      auVar364._12_4_ = 0x3f800000;
      auVar364._16_4_ = 0x3f800000;
      auVar364._20_4_ = 0x3f800000;
      auVar364._24_4_ = 0x3f800000;
      auVar364._28_4_ = 0x3f800000;
      auVar54._4_4_ = fStack_6fc * fVar350;
      auVar54._0_4_ = local_700 * fVar344;
      auVar54._8_4_ = fStack_6f8 * fVar352;
      auVar54._12_4_ = fStack_6f4 * fVar354;
      auVar54._16_4_ = fStack_6f0 * fVar356;
      auVar54._20_4_ = fStack_6ec * fVar358;
      auVar54._24_4_ = fStack_6e8 * fVar360;
      auVar54._28_4_ = uVar89;
      auVar324 = ZEXT864(0) << 0x20;
      auVar102 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fStack_5bc * fVar359;
      auVar55._0_4_ = local_5c0 * fVar357;
      auVar55._8_4_ = fStack_5b8 * fVar361;
      auVar55._12_4_ = fStack_5b4 * fVar367;
      auVar55._16_4_ = fStack_5b0 * fVar368;
      auVar55._20_4_ = fStack_5ac * fVar369;
      auVar55._24_4_ = fStack_5a8 * fVar370;
      auVar55._28_4_ = uVar89;
      auVar190 = vsubps_avx(auVar102,auVar55);
      auVar102 = vrcpps_avx(auVar190);
      fVar245 = auVar102._0_4_;
      fVar142 = auVar102._4_4_;
      auVar56._4_4_ = auVar190._4_4_ * fVar142;
      auVar56._0_4_ = auVar190._0_4_ * fVar245;
      fVar145 = auVar102._8_4_;
      auVar56._8_4_ = auVar190._8_4_ * fVar145;
      fVar148 = auVar102._12_4_;
      auVar56._12_4_ = auVar190._12_4_ * fVar148;
      fVar238 = auVar102._16_4_;
      auVar56._16_4_ = auVar190._16_4_ * fVar238;
      fVar240 = auVar102._20_4_;
      auVar56._20_4_ = auVar190._20_4_ * fVar240;
      fVar281 = auVar102._24_4_;
      auVar56._24_4_ = auVar190._24_4_ * fVar281;
      auVar56._28_4_ = local_820._28_4_;
      auVar24 = vsubps_avx(auVar364,auVar56);
      auVar102 = vandps_avx(auVar287,auVar190);
      auVar104._8_4_ = 0x219392ef;
      auVar104._0_8_ = 0x219392ef219392ef;
      auVar104._12_4_ = 0x219392ef;
      auVar104._16_4_ = 0x219392ef;
      auVar104._20_4_ = 0x219392ef;
      auVar104._24_4_ = 0x219392ef;
      auVar104._28_4_ = 0x219392ef;
      auVar130 = vcmpps_avx(auVar102,auVar104,1);
      auVar57._4_4_ = (fVar142 + fVar142 * auVar24._4_4_) * -auVar21._4_4_;
      auVar57._0_4_ = (fVar245 + fVar245 * auVar24._0_4_) * -auVar21._0_4_;
      auVar57._8_4_ = (fVar145 + fVar145 * auVar24._8_4_) * -auVar21._8_4_;
      auVar57._12_4_ = (fVar148 + fVar148 * auVar24._12_4_) * -auVar21._12_4_;
      auVar57._16_4_ = (fVar238 + fVar238 * auVar24._16_4_) * -auVar21._16_4_;
      auVar57._20_4_ = (fVar240 + fVar240 * auVar24._20_4_) * -auVar21._20_4_;
      auVar57._24_4_ = (fVar281 + fVar281 * auVar24._24_4_) * -auVar21._24_4_;
      auVar57._28_4_ = auVar21._28_4_ ^ 0x80000000;
      auVar102 = vcmpps_avx(auVar190,ZEXT832(0) << 0x20,1);
      auVar102 = vorps_avx(auVar130,auVar102);
      auVar102 = vblendvps_avx(auVar57,auVar347,auVar102);
      local_6a0 = vmaxps_avx(auVar191,auVar102);
      auVar102 = vcmpps_avx(auVar190,ZEXT832(0) << 0x20,6);
      auVar102 = vorps_avx(auVar130,auVar102);
      auVar102 = vblendvps_avx(auVar57,auVar373,auVar102);
      auVar101 = vandps_avx(local_2c0,auVar101);
      local_540 = vminps_avx(auVar23,auVar102);
      auVar102 = vcmpps_avx(local_6a0,local_540,2);
      auVar130 = auVar101 & auVar102;
      if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar130 >> 0x7f,0) == '\0') &&
            (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar130 >> 0xbf,0) == '\0') &&
          (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar130[0x1f]) goto LAB_009224d1;
      auVar130 = vminps_avx(local_6c0,_local_740);
      auVar21 = vminps_avx(local_6e0,_local_720);
      auVar130 = vminps_avx(auVar130,auVar21);
      auVar130 = vsubps_avx(auVar130,local_600);
      auVar101 = vandps_avx(auVar102,auVar101);
      auVar78._4_4_ = fStack_2fc;
      auVar78._0_4_ = local_300;
      auVar78._8_4_ = fStack_2f8;
      auVar78._12_4_ = fStack_2f4;
      auVar78._16_4_ = fStack_2f0;
      auVar78._20_4_ = fStack_2ec;
      auVar78._24_4_ = fStack_2e8;
      auVar78._28_4_ = fStack_2e4;
      auVar102 = vminps_avx(auVar78,auVar364);
      auVar191 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar102 = vmaxps_avx(auVar102,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar91 + fVar254 * (auVar102._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar110 + fVar195 * (auVar102._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar111 + fVar292 * (auVar102._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar112 + fVar196 * (auVar102._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar91 + fVar254 * (auVar102._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar110 + fVar195 * (auVar102._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar111 + fVar292 * (auVar102._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar112 + auVar102._28_4_ + 7.0;
      auVar79._4_4_ = fStack_2dc;
      auVar79._0_4_ = local_2e0;
      auVar79._8_4_ = fStack_2d8;
      auVar79._12_4_ = fStack_2d4;
      auVar79._16_4_ = fStack_2d0;
      auVar79._20_4_ = fStack_2cc;
      auVar79._24_4_ = fStack_2c8;
      auVar79._28_4_ = fStack_2c4;
      auVar102 = vminps_avx(auVar79,auVar364);
      auVar102 = vmaxps_avx(auVar102,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar91 + fVar254 * (auVar102._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar110 + fVar195 * (auVar102._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar111 + fVar292 * (auVar102._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar112 + fVar196 * (auVar102._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar91 + fVar254 * (auVar102._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar110 + fVar195 * (auVar102._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar111 + fVar292 * (auVar102._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar112 + auVar102._28_4_ + 7.0;
      auVar58._4_4_ = auVar130._4_4_ * 0.99999976;
      auVar58._0_4_ = auVar130._0_4_ * 0.99999976;
      auVar58._8_4_ = auVar130._8_4_ * 0.99999976;
      auVar58._12_4_ = auVar130._12_4_ * 0.99999976;
      auVar58._16_4_ = auVar130._16_4_ * 0.99999976;
      auVar58._20_4_ = auVar130._20_4_ * 0.99999976;
      auVar58._24_4_ = auVar130._24_4_ * 0.99999976;
      auVar58._28_4_ = 0x3f7ffffc;
      auVar102 = vmaxps_avx(ZEXT832(0) << 0x20,auVar58);
      auVar59._4_4_ = auVar102._4_4_ * auVar102._4_4_;
      auVar59._0_4_ = auVar102._0_4_ * auVar102._0_4_;
      auVar59._8_4_ = auVar102._8_4_ * auVar102._8_4_;
      auVar59._12_4_ = auVar102._12_4_ * auVar102._12_4_;
      auVar59._16_4_ = auVar102._16_4_ * auVar102._16_4_;
      auVar59._20_4_ = auVar102._20_4_ * auVar102._20_4_;
      auVar59._24_4_ = auVar102._24_4_ * auVar102._24_4_;
      auVar59._28_4_ = auVar102._28_4_;
      auVar130 = vsubps_avx(_local_9e0,auVar59);
      auVar60._4_4_ = auVar130._4_4_ * (float)local_5e0._4_4_;
      auVar60._0_4_ = auVar130._0_4_ * (float)local_5e0._0_4_;
      auVar60._8_4_ = auVar130._8_4_ * fStack_5d8;
      auVar60._12_4_ = auVar130._12_4_ * fStack_5d4;
      auVar60._16_4_ = auVar130._16_4_ * fStack_5d0;
      auVar60._20_4_ = auVar130._20_4_ * fStack_5cc;
      auVar60._24_4_ = auVar130._24_4_ * fStack_5c8;
      auVar60._28_4_ = auVar102._28_4_;
      auVar21 = vsubps_avx(local_800,auVar60);
      auVar102 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,5);
      if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0x7f,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar102 >> 0xbf,0) == '\0') &&
          (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar102[0x1f]) {
        auVar276 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar252 = ZEXT828(0) << 0x20;
        auVar208 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar227 = ZEXT1628(ZEXT816(0) << 0x40);
        auVar301 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar288._8_4_ = 0x7f800000;
        auVar288._0_8_ = 0x7f8000007f800000;
        auVar288._12_4_ = 0x7f800000;
        auVar288._16_4_ = 0x7f800000;
        auVar288._20_4_ = 0x7f800000;
        auVar288._24_4_ = 0x7f800000;
        auVar288._28_4_ = 0x7f800000;
        auVar321._8_4_ = 0xff800000;
        auVar321._0_8_ = 0xff800000ff800000;
        auVar321._12_4_ = 0xff800000;
        auVar321._16_4_ = 0xff800000;
        auVar321._20_4_ = 0xff800000;
        auVar321._24_4_ = 0xff800000;
        auVar321._28_4_ = 0xff800000;
      }
      else {
        local_900 = auVar130;
        auVar191 = vrcpps_avx(local_2a0);
        fVar245 = auVar191._0_4_;
        fVar254 = auVar191._4_4_;
        auVar61._4_4_ = local_2a0._4_4_ * fVar254;
        auVar61._0_4_ = local_2a0._0_4_ * fVar245;
        fVar142 = auVar191._8_4_;
        auVar61._8_4_ = local_2a0._8_4_ * fVar142;
        fVar145 = auVar191._12_4_;
        auVar61._12_4_ = local_2a0._12_4_ * fVar145;
        fVar148 = auVar191._16_4_;
        auVar61._16_4_ = local_2a0._16_4_ * fVar148;
        fVar195 = auVar191._20_4_;
        auVar61._20_4_ = local_2a0._20_4_ * fVar195;
        fVar238 = auVar191._24_4_;
        auVar61._24_4_ = local_2a0._24_4_ * fVar238;
        auVar61._28_4_ = auVar130._28_4_;
        auVar190 = vsubps_avx(auVar364,auVar61);
        auVar23 = vsqrtps_avx(auVar21);
        fVar245 = fVar245 + fVar245 * auVar190._0_4_;
        fVar254 = fVar254 + fVar254 * auVar190._4_4_;
        fVar142 = fVar142 + fVar142 * auVar190._8_4_;
        fVar145 = fVar145 + fVar145 * auVar190._12_4_;
        fVar148 = fVar148 + fVar148 * auVar190._16_4_;
        fVar195 = fVar195 + fVar195 * auVar190._20_4_;
        fVar238 = fVar238 + fVar238 * auVar190._24_4_;
        auVar24 = vsubps_avx(local_280,auVar23);
        fVar217 = auVar24._0_4_ * fVar245;
        fVar242 = auVar24._4_4_ * fVar254;
        auVar62._4_4_ = fVar242;
        auVar62._0_4_ = fVar217;
        fVar218 = auVar24._8_4_ * fVar142;
        auVar62._8_4_ = fVar218;
        fVar280 = auVar24._12_4_ * fVar145;
        auVar62._12_4_ = fVar280;
        fVar295 = auVar24._16_4_ * fVar148;
        auVar62._16_4_ = fVar295;
        fVar304 = auVar24._20_4_ * fVar195;
        auVar62._20_4_ = fVar304;
        fVar310 = auVar24._24_4_ * fVar238;
        auVar62._24_4_ = fVar310;
        auVar62._28_4_ = 0x7f800000;
        auVar24 = vsubps_avx(auVar23,local_660);
        fVar245 = auVar24._0_4_ * fVar245;
        fVar254 = auVar24._4_4_ * fVar254;
        auVar63._4_4_ = fVar254;
        auVar63._0_4_ = fVar245;
        fVar142 = auVar24._8_4_ * fVar142;
        auVar63._8_4_ = fVar142;
        fVar145 = auVar24._12_4_ * fVar145;
        auVar63._12_4_ = fVar145;
        fVar148 = auVar24._16_4_ * fVar148;
        auVar63._16_4_ = fVar148;
        fVar195 = auVar24._20_4_ * fVar195;
        auVar63._20_4_ = fVar195;
        fVar238 = auVar24._24_4_ * fVar238;
        auVar63._24_4_ = fVar238;
        auVar63._28_4_ = 0x3f800000;
        fVar240 = fVar247 * (fVar217 * local_4c0 + local_4e0);
        fVar281 = fVar256 * (fVar242 * fStack_4bc + fStack_4dc);
        fVar292 = fVar259 * (fVar218 * fStack_4b8 + fStack_4d8);
        fVar216 = fVar262 * (fVar280 * fStack_4b4 + fStack_4d4);
        fVar220 = fVar264 * (fVar295 * fStack_4b0 + fStack_4d0);
        fVar237 = fVar266 * (fVar304 * fStack_4ac + fStack_4cc);
        fVar196 = fVar268 * (fVar310 * fStack_4a8 + fStack_4c8);
        auVar210._0_4_ = local_7c0 + fVar374 * fVar240;
        auVar210._4_4_ = fStack_7bc + fVar376 * fVar281;
        auVar210._8_4_ = fStack_7b8 + fVar377 * fVar292;
        auVar210._12_4_ = aStack_7b4.w + fVar378 * fVar216;
        auVar210._16_4_ = fStack_7b0 + fVar379 * fVar220;
        auVar210._20_4_ = fStack_7ac + fVar380 * fVar237;
        auVar210._24_4_ = fStack_7a8 + fVar381 * fVar196;
        auVar210._28_4_ = fStack_7a4 + auVar24._28_4_;
        auVar64._4_4_ = fStack_5bc * fVar242;
        auVar64._0_4_ = local_5c0 * fVar217;
        auVar64._8_4_ = fStack_5b8 * fVar218;
        auVar64._12_4_ = fStack_5b4 * fVar280;
        auVar64._16_4_ = fStack_5b0 * fVar295;
        auVar64._20_4_ = fStack_5ac * fVar304;
        auVar64._24_4_ = fStack_5a8 * fVar310;
        auVar64._28_4_ = auVar23._28_4_;
        _local_9e0 = vsubps_avx(auVar64,auVar210);
        auVar232._0_4_ = fVar296 + fVar257 * fVar240;
        auVar232._4_4_ = fVar305 + fVar219 * fVar281;
        auVar232._8_4_ = fVar307 + fVar293 * fVar292;
        auVar232._12_4_ = fVar309 + fVar239 * fVar216;
        auVar232._16_4_ = fVar311 + fVar243 * fVar220;
        auVar232._20_4_ = fVar313 + fVar306 * fVar237;
        auVar232._24_4_ = fVar315 + fVar331 * fVar196;
        auVar232._28_4_ = fVar316 + auVar23._28_4_;
        auVar65._4_4_ = fStack_6fc * fVar242;
        auVar65._0_4_ = local_700 * fVar217;
        auVar65._8_4_ = fStack_6f8 * fVar218;
        auVar65._12_4_ = fStack_6f4 * fVar280;
        auVar65._16_4_ = fStack_6f0 * fVar295;
        auVar65._20_4_ = fStack_6ec * fVar304;
        auVar65._24_4_ = fStack_6e8 * fVar310;
        auVar65._28_4_ = 0x3e000000;
        local_7e0 = vsubps_avx(auVar65,auVar232);
        auVar192._0_4_ = local_9a0 + fVar260 * fVar240;
        auVar192._4_4_ = fStack_99c + fVar236 * fVar281;
        auVar192._8_4_ = fStack_998 + fVar294 * fVar292;
        auVar192._12_4_ = fStack_994 + fVar241 * fVar216;
        auVar192._16_4_ = fStack_990 + fVar244 * fVar220;
        auVar192._20_4_ = fStack_98c + fVar308 * fVar237;
        auVar192._24_4_ = fStack_988 + fVar342 * fVar196;
        auVar192._28_4_ = fStack_984 + auVar191._28_4_ + auVar190._28_4_ + fStack_4c4;
        auVar66._4_4_ = fStack_59c * fVar242;
        auVar66._0_4_ = local_5a0 * fVar217;
        auVar66._8_4_ = fStack_598 * fVar218;
        auVar66._12_4_ = fStack_594 * fVar280;
        auVar66._16_4_ = fStack_590 * fVar295;
        auVar66._20_4_ = fStack_58c * fVar304;
        auVar66._24_4_ = fStack_588 * fVar310;
        auVar66._28_4_ = 0x3e000000;
        auVar190 = vsubps_avx(auVar66,auVar192);
        fVar247 = fVar247 * (fVar245 * local_4c0 + local_4e0);
        fVar256 = fVar256 * (fVar254 * fStack_4bc + fStack_4dc);
        fVar259 = fVar259 * (fVar142 * fStack_4b8 + fStack_4d8);
        fVar262 = fVar262 * (fVar145 * fStack_4b4 + fStack_4d4);
        fVar264 = fVar264 * (fVar148 * fStack_4b0 + fStack_4d0);
        fVar266 = fVar266 * (fVar195 * fStack_4ac + fStack_4cc);
        fVar268 = fVar268 * (fVar238 * fStack_4a8 + fStack_4c8);
        auVar193._0_4_ = local_7c0 + fVar374 * fVar247;
        auVar193._4_4_ = fStack_7bc + fVar376 * fVar256;
        auVar193._8_4_ = fStack_7b8 + fVar377 * fVar259;
        auVar193._12_4_ = aStack_7b4.w + fVar378 * fVar262;
        auVar193._16_4_ = fStack_7b0 + fVar379 * fVar264;
        auVar193._20_4_ = fStack_7ac + fVar380 * fVar266;
        auVar193._24_4_ = fStack_7a8 + fVar381 * fVar268;
        auVar193._28_4_ = fStack_7a4 + auVar190._28_4_ + fStack_4c4;
        auVar67._4_4_ = fStack_5bc * fVar254;
        auVar67._0_4_ = local_5c0 * fVar245;
        auVar67._8_4_ = fStack_5b8 * fVar142;
        auVar67._12_4_ = fStack_5b4 * fVar145;
        auVar67._16_4_ = fStack_5b0 * fVar148;
        auVar67._20_4_ = fStack_5ac * fVar195;
        auVar67._24_4_ = fStack_5a8 * fVar238;
        auVar67._28_4_ = fVar353;
        auVar191 = vsubps_avx(auVar67,auVar193);
        auVar278._0_4_ = fVar296 + fVar257 * fVar247;
        auVar278._4_4_ = fVar305 + fVar219 * fVar256;
        auVar278._8_4_ = fVar307 + fVar293 * fVar259;
        auVar278._12_4_ = fVar309 + fVar239 * fVar262;
        auVar278._16_4_ = fVar311 + fVar243 * fVar264;
        auVar278._20_4_ = fVar313 + fVar306 * fVar266;
        auVar278._24_4_ = fVar315 + fVar331 * fVar268;
        auVar278._28_4_ = fVar316 + fVar353;
        auVar68._4_4_ = fStack_6fc * fVar254;
        auVar68._0_4_ = local_700 * fVar245;
        auVar68._8_4_ = fStack_6f8 * fVar142;
        auVar68._12_4_ = fStack_6f4 * fVar145;
        auVar68._16_4_ = fStack_6f0 * fVar148;
        auVar68._20_4_ = fStack_6ec * fVar195;
        auVar68._24_4_ = fStack_6e8 * fVar238;
        auVar68._28_4_ = fStack_6e4;
        auVar23 = vsubps_avx(auVar68,auVar278);
        auVar276 = auVar23._0_28_;
        auVar253._0_4_ = local_9a0 + fVar260 * fVar247;
        auVar253._4_4_ = fStack_99c + fVar236 * fVar256;
        auVar253._8_4_ = fStack_998 + fVar294 * fVar259;
        auVar253._12_4_ = fStack_994 + fVar241 * fVar262;
        auVar253._16_4_ = fStack_990 + fVar244 * fVar264;
        auVar253._20_4_ = fStack_98c + fVar308 * fVar266;
        auVar253._24_4_ = fStack_988 + fVar342 * fVar268;
        auVar253._28_4_ = fStack_984 + 0.125;
        auVar69._4_4_ = fStack_59c * fVar254;
        auVar69._0_4_ = local_5a0 * fVar245;
        auVar69._8_4_ = fStack_598 * fVar142;
        auVar69._12_4_ = fStack_594 * fVar145;
        auVar69._16_4_ = fStack_590 * fVar148;
        auVar69._20_4_ = fStack_58c * fVar195;
        auVar69._24_4_ = fStack_588 * fVar238;
        auVar69._28_4_ = fStack_6e4;
        auVar23 = vsubps_avx(auVar69,auVar253);
        auVar252 = auVar23._0_28_;
        auVar21 = vcmpps_avx(auVar21,_DAT_01f7b000,5);
        auVar289._8_4_ = 0x7f800000;
        auVar289._0_8_ = 0x7f8000007f800000;
        auVar289._12_4_ = 0x7f800000;
        auVar289._16_4_ = 0x7f800000;
        auVar289._20_4_ = 0x7f800000;
        auVar289._24_4_ = 0x7f800000;
        auVar289._28_4_ = 0x7f800000;
        auVar288 = vblendvps_avx(auVar289,auVar62,auVar21);
        auVar23 = vmaxps_avx(local_4a0,local_340);
        auVar70._4_4_ = auVar23._4_4_ * 1.9073486e-06;
        auVar70._0_4_ = auVar23._0_4_ * 1.9073486e-06;
        auVar70._8_4_ = auVar23._8_4_ * 1.9073486e-06;
        auVar70._12_4_ = auVar23._12_4_ * 1.9073486e-06;
        auVar70._16_4_ = auVar23._16_4_ * 1.9073486e-06;
        auVar70._20_4_ = auVar23._20_4_ * 1.9073486e-06;
        auVar70._24_4_ = auVar23._24_4_ * 1.9073486e-06;
        auVar70._28_4_ = auVar23._28_4_;
        auVar23 = vcmpps_avx(local_9c0,auVar70,1);
        auVar322._8_4_ = 0xff800000;
        auVar322._0_8_ = 0xff800000ff800000;
        auVar322._12_4_ = 0xff800000;
        auVar322._16_4_ = 0xff800000;
        auVar322._20_4_ = 0xff800000;
        auVar322._24_4_ = 0xff800000;
        auVar322._28_4_ = 0xff800000;
        auVar321 = vblendvps_avx(auVar322,auVar63,auVar21);
        auVar24 = auVar21 & auVar23;
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0x7f,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0xbf,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar24[0x1f] < '\0') {
          auVar102 = vandps_avx(auVar23,auVar21);
          auVar181 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
          auVar23 = vcmpps_avx(auVar130,ZEXT832(0) << 0x20,2);
          auVar137._8_4_ = 0xff800000;
          auVar137._0_8_ = 0xff800000ff800000;
          auVar137._12_4_ = 0xff800000;
          auVar137._16_4_ = 0xff800000;
          auVar137._20_4_ = 0xff800000;
          auVar137._24_4_ = 0xff800000;
          auVar137._28_4_ = 0xff800000;
          auVar214._8_4_ = 0x7f800000;
          auVar214._0_8_ = 0x7f8000007f800000;
          auVar214._12_4_ = 0x7f800000;
          auVar214._16_4_ = 0x7f800000;
          auVar214._20_4_ = 0x7f800000;
          auVar214._24_4_ = 0x7f800000;
          auVar214._28_4_ = 0x7f800000;
          auVar130 = vblendvps_avx(auVar214,auVar137,auVar23);
          auVar178 = vpmovsxwd_avx(auVar181);
          auVar181 = vpunpckhwd_avx(auVar181,auVar181);
          auVar365._16_16_ = auVar181;
          auVar365._0_16_ = auVar178;
          auVar288 = vblendvps_avx(auVar288,auVar130,auVar365);
          auVar130 = vblendvps_avx(auVar137,auVar214,auVar23);
          auVar321 = vblendvps_avx(auVar321,auVar130,auVar365);
          auVar172._0_8_ = auVar102._0_8_ ^ 0xffffffffffffffff;
          auVar172._8_4_ = auVar102._8_4_ ^ 0xffffffff;
          auVar172._12_4_ = auVar102._12_4_ ^ 0xffffffff;
          auVar172._16_4_ = auVar102._16_4_ ^ 0xffffffff;
          auVar172._20_4_ = auVar102._20_4_ ^ 0xffffffff;
          auVar172._24_4_ = auVar102._24_4_ ^ 0xffffffff;
          auVar172._28_4_ = auVar102._28_4_ ^ 0xffffffff;
          auVar102 = vorps_avx(auVar23,auVar172);
          auVar102 = vandps_avx(auVar21,auVar102);
        }
        auVar208 = local_9e0._0_28_;
        auVar227 = local_7e0._0_28_;
        auVar301 = auVar190._0_28_;
      }
      fVar245 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar254 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar257 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_520 = local_6a0;
      local_500 = vminps_avx(local_540,auVar288);
      _local_560 = vmaxps_avx(local_6a0,auVar321);
      auVar324 = ZEXT3264(_local_560);
      auVar130 = vcmpps_avx(local_6a0,local_500,2);
      _local_5e0 = vandps_avx(auVar130,auVar101);
      auVar290 = ZEXT3264(_local_5e0);
      auVar130 = vcmpps_avx(_local_560,local_540,2);
      local_760 = vandps_avx(auVar130,auVar101);
      auVar101 = vorps_avx(_local_5e0,local_760);
      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0x7f,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0xbf,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar101[0x1f]) goto LAB_009224d1;
      _local_720 = _local_560;
      local_800._0_8_ = uVar82;
      fVar260 = local_760._28_4_;
      auVar106._0_4_ =
           fVar245 * auVar191._0_4_ + fVar254 * auVar276._0_4_ + fVar257 * auVar252._0_4_;
      auVar106._4_4_ =
           fVar245 * auVar191._4_4_ + fVar254 * auVar276._4_4_ + fVar257 * auVar252._4_4_;
      auVar106._8_4_ =
           fVar245 * auVar191._8_4_ + fVar254 * auVar276._8_4_ + fVar257 * auVar252._8_4_;
      auVar106._12_4_ =
           fVar245 * auVar191._12_4_ + fVar254 * auVar276._12_4_ + fVar257 * auVar252._12_4_;
      auVar106._16_4_ =
           fVar245 * auVar191._16_4_ + fVar254 * auVar276._16_4_ + fVar257 * auVar252._16_4_;
      auVar106._20_4_ =
           fVar245 * auVar191._20_4_ + fVar254 * auVar276._20_4_ + fVar257 * auVar252._20_4_;
      auVar106._24_4_ =
           fVar245 * auVar191._24_4_ + fVar254 * auVar276._24_4_ + fVar257 * auVar252._24_4_;
      auVar106._28_4_ = fVar260 + fVar260 + auVar101._28_4_;
      auVar167._0_8_ = auVar102._0_8_ ^ 0xffffffffffffffff;
      auVar167._8_4_ = auVar102._8_4_ ^ 0xffffffff;
      auVar167._12_4_ = auVar102._12_4_ ^ 0xffffffff;
      auVar167._16_4_ = auVar102._16_4_ ^ 0xffffffff;
      auVar167._20_4_ = auVar102._20_4_ ^ 0xffffffff;
      auVar167._24_4_ = auVar102._24_4_ ^ 0xffffffff;
      auVar167._28_4_ = auVar102._28_4_ ^ 0xffffffff;
      auVar211._8_4_ = 0x7fffffff;
      auVar211._0_8_ = 0x7fffffff7fffffff;
      auVar211._12_4_ = 0x7fffffff;
      auVar211._16_4_ = 0x7fffffff;
      auVar211._20_4_ = 0x7fffffff;
      auVar211._24_4_ = 0x7fffffff;
      auVar211._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(auVar106,auVar211);
      auVar233._8_4_ = 0x3e99999a;
      auVar233._0_8_ = 0x3e99999a3e99999a;
      auVar233._12_4_ = 0x3e99999a;
      auVar233._16_4_ = 0x3e99999a;
      auVar233._20_4_ = 0x3e99999a;
      auVar233._24_4_ = 0x3e99999a;
      auVar233._28_4_ = 0x3e99999a;
      auVar101 = vcmpps_avx(auVar101,auVar233,1);
      local_620 = vorps_avx(auVar101,auVar167);
      auVar107._0_4_ =
           fVar245 * auVar208._0_4_ + fVar254 * auVar227._0_4_ + auVar301._0_4_ * fVar257;
      auVar107._4_4_ =
           fVar245 * auVar208._4_4_ + fVar254 * auVar227._4_4_ + auVar301._4_4_ * fVar257;
      auVar107._8_4_ =
           fVar245 * auVar208._8_4_ + fVar254 * auVar227._8_4_ + auVar301._8_4_ * fVar257;
      auVar107._12_4_ =
           fVar245 * auVar208._12_4_ + fVar254 * auVar227._12_4_ + auVar301._12_4_ * fVar257;
      auVar107._16_4_ =
           fVar245 * auVar208._16_4_ + fVar254 * auVar227._16_4_ + auVar301._16_4_ * fVar257;
      auVar107._20_4_ =
           fVar245 * auVar208._20_4_ + fVar254 * auVar227._20_4_ + auVar301._20_4_ * fVar257;
      auVar107._24_4_ =
           fVar245 * auVar208._24_4_ + fVar254 * auVar227._24_4_ + auVar301._24_4_ * fVar257;
      auVar107._28_4_ = fVar260 + auVar191._28_4_ + local_620._28_4_;
      auVar101 = vandps_avx(auVar107,auVar211);
      auVar101 = vcmpps_avx(auVar101,auVar233,1);
      auVar101 = vorps_avx(auVar101,auVar167);
      auVar131._8_4_ = 3;
      auVar131._0_8_ = 0x300000003;
      auVar131._12_4_ = 3;
      auVar131._16_4_ = 3;
      auVar131._20_4_ = 3;
      auVar131._24_4_ = 3;
      auVar131._28_4_ = 3;
      auVar168._8_4_ = 2;
      auVar168._0_8_ = 0x200000002;
      auVar168._12_4_ = 2;
      auVar168._16_4_ = 2;
      auVar168._20_4_ = 2;
      auVar168._24_4_ = 2;
      auVar168._28_4_ = 2;
      auVar101 = vblendvps_avx(auVar168,auVar131,auVar101);
      local_640 = ZEXT432(local_aec);
      auVar178 = vpshufd_avx(ZEXT416(local_aec),0);
      auVar181 = vpcmpgtd_avx(auVar101._16_16_,auVar178);
      local_660._0_16_ = auVar178;
      auVar178 = vpcmpgtd_avx(auVar101._0_16_,auVar178);
      auVar132._16_16_ = auVar181;
      auVar132._0_16_ = auVar178;
      local_600 = vblendps_avx(ZEXT1632(auVar178),auVar132,0xf0);
      auVar101 = vandnps_avx(local_600,_local_5e0);
      local_740._4_4_ = local_6a0._4_4_ + (float)local_780._4_4_;
      local_740._0_4_ = local_6a0._0_4_ + (float)local_780._0_4_;
      fStack_738 = local_6a0._8_4_ + fStack_778;
      fStack_734 = local_6a0._12_4_ + fStack_774;
      fStack_730 = local_6a0._16_4_ + fStack_770;
      fStack_72c = local_6a0._20_4_ + fStack_76c;
      fStack_728 = local_6a0._24_4_ + fStack_768;
      fStack_724 = local_6a0._28_4_ + fStack_764;
      while( true ) {
        local_360 = auVar101;
        local_aa0 = auVar19._0_4_;
        fStack_a9c = auVar19._4_4_;
        fStack_a98 = auVar19._8_4_;
        fStack_a94 = auVar19._12_4_;
        local_a90 = auVar17._0_4_;
        fStack_a8c = auVar17._4_4_;
        fStack_a88 = auVar17._8_4_;
        fStack_a84 = auVar17._12_4_;
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0x7f,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0xbf,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar101[0x1f]) break;
        auVar133._8_4_ = 0x7f800000;
        auVar133._0_8_ = 0x7f8000007f800000;
        auVar133._12_4_ = 0x7f800000;
        auVar133._16_4_ = 0x7f800000;
        auVar133._20_4_ = 0x7f800000;
        auVar133._24_4_ = 0x7f800000;
        auVar133._28_4_ = 0x7f800000;
        auVar102 = vblendvps_avx(auVar133,local_6a0,auVar101);
        auVar130 = vshufps_avx(auVar102,auVar102,0xb1);
        auVar130 = vminps_avx(auVar102,auVar130);
        auVar21 = vshufpd_avx(auVar130,auVar130,5);
        auVar130 = vminps_avx(auVar130,auVar21);
        auVar21 = vperm2f128_avx(auVar130,auVar130,1);
        auVar130 = vminps_avx(auVar130,auVar21);
        auVar102 = vcmpps_avx(auVar102,auVar130,0);
        auVar130 = auVar101 & auVar102;
        if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar130 >> 0x7f,0) != '\0') ||
              (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0xbf,0) != '\0') ||
            (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar130[0x1f] < '\0') {
          auVar101 = vandps_avx(auVar102,auVar101);
        }
        uVar80 = vmovmskps_avx(auVar101);
        uVar85 = 0;
        if (uVar80 != 0) {
          for (; (uVar80 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
          }
        }
        uVar82 = (ulong)uVar85;
        *(undefined4 *)(local_360 + uVar82 * 4) = 0;
        aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
        local_7c0 = aVar9.x;
        fStack_7bc = aVar9.y;
        fStack_7b8 = aVar9.z;
        aStack_7b4 = aVar9.field_3;
        auVar181 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
        fVar245 = local_1a0[uVar82];
        local_9a0 = *(float *)(local_520 + uVar82 * 4);
        auVar272 = ZEXT416((uint)local_9a0);
        if (auVar181._0_4_ < 0.0) {
          fStack_99c = 0.0;
          fStack_998 = 0.0;
          fStack_994 = 0.0;
          auVar290 = ZEXT1664(auVar290._0_16_);
          fVar254 = sqrtf(auVar181._0_4_);
          auVar272._4_4_ = fStack_99c;
          auVar272._0_4_ = local_9a0;
          auVar272._8_4_ = fStack_998;
          auVar272._12_4_ = fStack_994;
        }
        else {
          auVar181 = vsqrtss_avx(auVar181,auVar181);
          fVar254 = auVar181._0_4_;
        }
        auVar178 = vminps_avx(auVar17,_local_930);
        auVar181 = vmaxps_avx(auVar17,_local_930);
        auVar95 = vminps_avx(auVar19,_local_940);
        auVar158 = vminps_avx(auVar178,auVar95);
        auVar178 = vmaxps_avx(auVar19,_local_940);
        auVar95 = vmaxps_avx(auVar181,auVar178);
        auVar177._8_4_ = 0x7fffffff;
        auVar177._0_8_ = 0x7fffffff7fffffff;
        auVar177._12_4_ = 0x7fffffff;
        auVar181 = vandps_avx(auVar158,auVar177);
        auVar178 = vandps_avx(auVar95,auVar177);
        auVar181 = vmaxps_avx(auVar181,auVar178);
        auVar178 = vmovshdup_avx(auVar181);
        auVar178 = vmaxss_avx(auVar178,auVar181);
        auVar181 = vshufpd_avx(auVar181,auVar181,1);
        auVar181 = vmaxss_avx(auVar181,auVar178);
        local_9c0._0_4_ = auVar181._0_4_ * 1.9073486e-06;
        local_900._0_4_ = fVar254 * 1.9073486e-06;
        local_6e0._0_16_ = vshufps_avx(auVar95,auVar95,0xff);
        auVar181 = vinsertps_avx(auVar272,ZEXT416((uint)fVar245),0x10);
        auVar324 = ZEXT1664(auVar181);
        lVar87 = 5;
        do {
          do {
            auVar181 = auVar324._0_16_;
            bVar90 = lVar87 == 0;
            lVar87 = lVar87 + -1;
            if (bVar90) goto LAB_00922fcb;
            auVar178 = vshufps_avx(auVar181,auVar181,0);
            auVar94._0_4_ = auVar178._0_4_ * local_7c0 + 0.0;
            auVar94._4_4_ = auVar178._4_4_ * fStack_7bc + 0.0;
            auVar94._8_4_ = auVar178._8_4_ * fStack_7b8 + 0.0;
            auVar94._12_4_ = auVar178._12_4_ * aStack_7b4.w + 0.0;
            auVar178 = vmovshdup_avx(auVar181);
            fVar145 = auVar178._0_4_;
            fVar142 = 1.0 - fVar145;
            fVar254 = fVar145 * fVar145;
            fVar257 = fVar145 * 3.0;
            fVar245 = fVar257 + -5.0;
            fVar260 = fVar142 * fVar142;
            auVar178 = ZEXT416((uint)(fVar145 * fVar145 * -fVar142 * 0.5));
            auVar178 = vshufps_avx(auVar178,auVar178,0);
            auVar95 = ZEXT416((uint)((fVar260 * (fVar142 * 3.0 + -5.0) + 2.0) * 0.5));
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar158 = ZEXT416((uint)((fVar254 * fVar245 + 2.0) * 0.5));
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            auVar117 = ZEXT416((uint)(fVar142 * fVar142 * -fVar145 * 0.5));
            auVar117 = vshufps_avx(auVar117,auVar117,0);
            auVar159._0_4_ =
                 auVar117._0_4_ * local_a90 +
                 auVar158._0_4_ * (float)local_930._0_4_ +
                 auVar95._0_4_ * local_aa0 + auVar178._0_4_ * (float)local_940._0_4_;
            auVar159._4_4_ =
                 auVar117._4_4_ * fStack_a8c +
                 auVar158._4_4_ * (float)local_930._4_4_ +
                 auVar95._4_4_ * fStack_a9c + auVar178._4_4_ * (float)local_940._4_4_;
            auVar159._8_4_ =
                 auVar117._8_4_ * fStack_a88 +
                 auVar158._8_4_ * fStack_928 +
                 auVar95._8_4_ * fStack_a98 + auVar178._8_4_ * fStack_938;
            auVar159._12_4_ =
                 auVar117._12_4_ * fStack_a84 +
                 auVar158._12_4_ * fStack_924 +
                 auVar95._12_4_ * fStack_a94 + auVar178._12_4_ * fStack_934;
            local_7e0._0_16_ = auVar159;
            auVar178 = vsubps_avx(auVar94,auVar159);
            _local_9e0 = auVar178;
            auVar178 = vdpps_avx(auVar178,auVar178,0x7f);
            local_9a0 = auVar178._0_4_;
            fStack_99c = auVar178._4_4_;
            fStack_998 = auVar178._8_4_;
            fStack_994 = auVar178._12_4_;
            if (local_9a0 < 0.0) {
              local_960._0_4_ = fVar254;
              local_820._0_16_ = ZEXT416((uint)fVar142);
              local_980._0_4_ = fVar257;
              local_840._0_4_ = fVar145 * 9.0;
              local_860._0_4_ = fVar245;
              local_880._0_4_ = fVar260;
              local_6c0._0_4_ = fVar142 * -2.0;
              fVar148 = sqrtf(local_9a0);
              fVar245 = (float)local_860._0_4_;
              fVar236 = (float)local_840._0_4_;
              fVar195 = (float)local_6c0._0_4_;
              fVar254 = (float)local_960._0_4_;
              fVar219 = (float)local_980._0_4_;
              fVar260 = (float)local_880._0_4_;
              fVar142 = (float)local_820._0_4_;
            }
            else {
              auVar178 = vsqrtss_avx(auVar178,auVar178);
              fVar148 = auVar178._0_4_;
              fVar236 = fVar145 * 9.0;
              fVar195 = fVar142 * -2.0;
              fVar219 = fVar257;
            }
            auVar178 = ZEXT416((uint)((fVar254 + fVar145 * fVar195) * 0.5));
            auVar178 = vshufps_avx(auVar178,auVar178,0);
            auVar95 = ZEXT416((uint)(((fVar142 + fVar142) * (fVar219 + 2.0) +
                                     fVar142 * fVar142 * -3.0) * 0.5));
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar158 = ZEXT416((uint)((fVar245 * (fVar145 + fVar145) + fVar145 * fVar219) * 0.5));
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            auVar290 = ZEXT1664(_local_930);
            auVar117 = ZEXT416((uint)((fVar145 * (fVar142 + fVar142) - fVar260) * 0.5));
            auVar117 = vshufps_avx(auVar117,auVar117,0);
            auVar334._0_4_ =
                 local_a90 * auVar117._0_4_ +
                 local_930._0_4_ * auVar158._0_4_ +
                 (float)local_940._0_4_ * auVar178._0_4_ + local_aa0 * auVar95._0_4_;
            auVar334._4_4_ =
                 fStack_a8c * auVar117._4_4_ +
                 local_930._4_4_ * auVar158._4_4_ +
                 (float)local_940._4_4_ * auVar178._4_4_ + fStack_a9c * auVar95._4_4_;
            auVar334._8_4_ =
                 fStack_a88 * auVar117._8_4_ +
                 local_930._8_4_ * auVar158._8_4_ +
                 fStack_938 * auVar178._8_4_ + fStack_a98 * auVar95._8_4_;
            auVar334._12_4_ =
                 fStack_a84 * auVar117._12_4_ +
                 local_930._12_4_ * auVar158._12_4_ +
                 fStack_934 * auVar178._12_4_ + fStack_a94 * auVar95._12_4_;
            auVar117 = vpermilps_avx(ZEXT416((uint)(fVar257 + -1.0)),0);
            auVar251 = vpermilps_avx(ZEXT416((uint)(fVar145 * -9.0 + 4.0)),0);
            auVar178 = vshufps_avx(ZEXT416((uint)(fVar236 + -5.0)),ZEXT416((uint)(fVar236 + -5.0)),0
                                  );
            auVar95 = ZEXT416((uint)(fVar145 * -3.0 + 2.0));
            auVar158 = vshufps_avx(auVar95,auVar95,0);
            auVar95 = vdpps_avx(auVar334,auVar334,0x7f);
            auVar118._0_4_ =
                 local_a90 * auVar158._0_4_ +
                 local_930._0_4_ * auVar178._0_4_ +
                 local_aa0 * auVar251._0_4_ + (float)local_940._0_4_ * auVar117._0_4_;
            auVar118._4_4_ =
                 fStack_a8c * auVar158._4_4_ +
                 local_930._4_4_ * auVar178._4_4_ +
                 fStack_a9c * auVar251._4_4_ + (float)local_940._4_4_ * auVar117._4_4_;
            auVar118._8_4_ =
                 fStack_a88 * auVar158._8_4_ +
                 local_930._8_4_ * auVar178._8_4_ +
                 fStack_a98 * auVar251._8_4_ + fStack_938 * auVar117._8_4_;
            auVar118._12_4_ =
                 fStack_a84 * auVar158._12_4_ +
                 local_930._12_4_ * auVar178._12_4_ +
                 fStack_a94 * auVar251._12_4_ + fStack_934 * auVar117._12_4_;
            auVar178 = vblendps_avx(auVar95,_DAT_01f45a50,0xe);
            auVar158 = vrsqrtss_avx(auVar178,auVar178);
            fVar254 = auVar158._0_4_;
            fVar245 = auVar95._0_4_;
            auVar158 = vdpps_avx(auVar334,auVar118,0x7f);
            auVar117 = vshufps_avx(auVar95,auVar95,0);
            auVar119._0_4_ = auVar118._0_4_ * auVar117._0_4_;
            auVar119._4_4_ = auVar118._4_4_ * auVar117._4_4_;
            auVar119._8_4_ = auVar118._8_4_ * auVar117._8_4_;
            auVar119._12_4_ = auVar118._12_4_ * auVar117._12_4_;
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            auVar200._0_4_ = auVar334._0_4_ * auVar158._0_4_;
            auVar200._4_4_ = auVar334._4_4_ * auVar158._4_4_;
            auVar200._8_4_ = auVar334._8_4_ * auVar158._8_4_;
            auVar200._12_4_ = auVar334._12_4_ * auVar158._12_4_;
            auVar251 = vsubps_avx(auVar119,auVar200);
            auVar158 = vrcpss_avx(auVar178,auVar178);
            auVar178 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                  ZEXT416((uint)(auVar324._0_4_ * (float)local_900._0_4_)));
            auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar245 * auVar158._0_4_)));
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            uVar82 = CONCAT44(auVar334._4_4_,auVar334._0_4_);
            auVar224._0_8_ = uVar82 ^ 0x8000000080000000;
            auVar224._8_4_ = -auVar334._8_4_;
            auVar224._12_4_ = -auVar334._12_4_;
            auVar117 = ZEXT416((uint)(fVar254 * 1.5 + fVar245 * -0.5 * fVar254 * fVar254 * fVar254))
            ;
            auVar117 = vshufps_avx(auVar117,auVar117,0);
            auVar179._0_4_ = auVar117._0_4_ * auVar251._0_4_ * auVar158._0_4_;
            auVar179._4_4_ = auVar117._4_4_ * auVar251._4_4_ * auVar158._4_4_;
            auVar179._8_4_ = auVar117._8_4_ * auVar251._8_4_ * auVar158._8_4_;
            auVar179._12_4_ = auVar117._12_4_ * auVar251._12_4_ * auVar158._12_4_;
            auVar250._0_4_ = auVar334._0_4_ * auVar117._0_4_;
            auVar250._4_4_ = auVar334._4_4_ * auVar117._4_4_;
            auVar250._8_4_ = auVar334._8_4_ * auVar117._8_4_;
            auVar250._12_4_ = auVar334._12_4_ * auVar117._12_4_;
            if (fVar245 < 0.0) {
              local_960._0_16_ = auVar224;
              local_820._0_16_ = auVar250;
              local_980._0_16_ = auVar179;
              auVar290 = ZEXT1664(_local_930);
              fVar245 = sqrtf(fVar245);
              auVar179 = local_980._0_16_;
              auVar224 = local_960._0_16_;
              auVar250 = local_820._0_16_;
            }
            else {
              auVar95 = vsqrtss_avx(auVar95,auVar95);
              fVar245 = auVar95._0_4_;
            }
            auVar273._4_4_ = fStack_99c;
            auVar273._0_4_ = local_9a0;
            auVar273._8_4_ = fStack_998;
            auVar273._12_4_ = fStack_994;
            auVar95 = vdpps_avx(_local_9e0,auVar250,0x7f);
            fVar245 = ((float)local_9c0._0_4_ / fVar245) * (fVar148 + 1.0) +
                      auVar178._0_4_ + fVar148 * (float)local_9c0._0_4_;
            auVar158 = vdpps_avx(auVar224,auVar250,0x7f);
            auVar117 = vdpps_avx(_local_9e0,auVar179,0x7f);
            auVar75._4_4_ = fStack_7bc;
            auVar75._0_4_ = local_7c0;
            auVar75._8_4_ = fStack_7b8;
            auVar75._12_4_ = aStack_7b4.a;
            auVar251 = vdpps_avx(auVar75,auVar250,0x7f);
            auVar18 = vdpps_avx(_local_9e0,auVar224,0x7f);
            fVar254 = auVar158._0_4_ + auVar117._0_4_;
            fVar257 = auVar95._0_4_;
            auVar96._0_4_ = fVar257 * fVar257;
            auVar96._4_4_ = auVar95._4_4_ * auVar95._4_4_;
            auVar96._8_4_ = auVar95._8_4_ * auVar95._8_4_;
            auVar96._12_4_ = auVar95._12_4_ * auVar95._12_4_;
            auVar117 = vsubps_avx(auVar273,auVar96);
            auVar158 = vdpps_avx(_local_9e0,auVar75,0x7f);
            fVar260 = auVar18._0_4_ - fVar257 * fVar254;
            fVar142 = auVar158._0_4_ - fVar257 * auVar251._0_4_;
            auVar158 = vrsqrtss_avx(auVar117,auVar117);
            fVar145 = auVar117._0_4_;
            fVar257 = auVar158._0_4_;
            fVar257 = fVar257 * 1.5 + fVar145 * -0.5 * fVar257 * fVar257 * fVar257;
            if (fVar145 < 0.0) {
              local_960._0_4_ = fVar245;
              local_820._0_16_ = auVar251;
              local_980._0_16_ = ZEXT416((uint)fVar254);
              local_840._0_4_ = fVar260;
              local_860._0_4_ = fVar142;
              local_880._0_4_ = fVar257;
              auVar290 = ZEXT1664(auVar290._0_16_);
              fVar145 = sqrtf(fVar145);
              auVar273._4_4_ = fStack_99c;
              auVar273._0_4_ = local_9a0;
              auVar273._8_4_ = fStack_998;
              auVar273._12_4_ = fStack_994;
              fVar245 = (float)local_960._0_4_;
              fVar257 = (float)local_880._0_4_;
              fVar260 = (float)local_840._0_4_;
              fVar142 = (float)local_860._0_4_;
              auVar251 = local_820._0_16_;
              auVar158 = local_980._0_16_;
            }
            else {
              auVar158 = vsqrtss_avx(auVar117,auVar117);
              fVar145 = auVar158._0_4_;
              auVar158 = ZEXT416((uint)fVar254);
            }
            auVar18 = vpermilps_avx(local_7e0._0_16_,0xff);
            auVar20 = vshufps_avx(auVar334,auVar334,0xff);
            fVar254 = fVar260 * fVar257 - auVar20._0_4_;
            auVar201._0_8_ = auVar251._0_8_ ^ 0x8000000080000000;
            auVar201._8_4_ = auVar251._8_4_ ^ 0x80000000;
            auVar201._12_4_ = auVar251._12_4_ ^ 0x80000000;
            auVar225._0_4_ = -fVar254;
            auVar225._4_4_ = 0x80000000;
            auVar225._8_4_ = 0x80000000;
            auVar225._12_4_ = 0x80000000;
            auVar117 = vinsertps_avx(auVar225,ZEXT416((uint)(fVar142 * fVar257)),0x1c);
            auVar251 = vmovsldup_avx(ZEXT416((uint)(auVar158._0_4_ * fVar142 * fVar257 -
                                                   auVar251._0_4_ * fVar254)));
            auVar117 = vdivps_avx(auVar117,auVar251);
            auVar158 = vinsertps_avx(auVar158,auVar201,0x10);
            auVar158 = vdivps_avx(auVar158,auVar251);
            auVar251 = vmovsldup_avx(auVar95);
            auVar97 = ZEXT416((uint)(fVar145 - auVar18._0_4_));
            auVar18 = vmovsldup_avx(auVar97);
            auVar160._0_4_ = auVar251._0_4_ * auVar117._0_4_ + auVar18._0_4_ * auVar158._0_4_;
            auVar160._4_4_ = auVar251._4_4_ * auVar117._4_4_ + auVar18._4_4_ * auVar158._4_4_;
            auVar160._8_4_ = auVar251._8_4_ * auVar117._8_4_ + auVar18._8_4_ * auVar158._8_4_;
            auVar160._12_4_ = auVar251._12_4_ * auVar117._12_4_ + auVar18._12_4_ * auVar158._12_4_;
            auVar158 = vsubps_avx(auVar181,auVar160);
            auVar324 = ZEXT1664(auVar158);
            auVar161._8_4_ = 0x7fffffff;
            auVar161._0_8_ = 0x7fffffff7fffffff;
            auVar161._12_4_ = 0x7fffffff;
            auVar181 = vandps_avx(auVar95,auVar161);
          } while (fVar245 <= auVar181._0_4_);
          auVar180._8_4_ = 0x7fffffff;
          auVar180._0_8_ = 0x7fffffff7fffffff;
          auVar180._12_4_ = 0x7fffffff;
          auVar181 = vandps_avx(auVar97,auVar180);
        } while ((float)local_6e0._0_4_ * 1.9073486e-06 + auVar178._0_4_ + fVar245 <= auVar181._0_4_
                );
        fVar245 = auVar158._0_4_ + (float)local_7a0._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar245) &&
           (fVar254 = (ray->super_RayK<1>).tfar, fVar245 <= fVar254)) {
          auVar181 = vmovshdup_avx(auVar158);
          fVar257 = auVar181._0_4_;
          if ((0.0 <= fVar257) && (fVar257 <= 1.0)) {
            auVar181 = vrsqrtss_avx(auVar273,auVar273);
            fVar260 = auVar181._0_4_;
            pGVar12 = (context->scene->geometries).items[uVar84].ptr;
            if ((pGVar12->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar181 = ZEXT416((uint)(fVar260 * 1.5 +
                                       auVar273._0_4_ * -0.5 * fVar260 * fVar260 * fVar260));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar182._0_4_ = auVar181._0_4_ * (float)local_9e0._0_4_;
              auVar182._4_4_ = auVar181._4_4_ * (float)local_9e0._4_4_;
              auVar182._8_4_ = auVar181._8_4_ * fStack_9d8;
              auVar182._12_4_ = auVar181._12_4_ * fStack_9d4;
              auVar120._0_4_ = auVar334._0_4_ + auVar20._0_4_ * auVar182._0_4_;
              auVar120._4_4_ = auVar334._4_4_ + auVar20._4_4_ * auVar182._4_4_;
              auVar120._8_4_ = auVar334._8_4_ + auVar20._8_4_ * auVar182._8_4_;
              auVar120._12_4_ = auVar334._12_4_ + auVar20._12_4_ * auVar182._12_4_;
              auVar181 = vshufps_avx(auVar182,auVar182,0xc9);
              auVar178 = vshufps_avx(auVar334,auVar334,0xc9);
              auVar183._0_4_ = auVar178._0_4_ * auVar182._0_4_;
              auVar183._4_4_ = auVar178._4_4_ * auVar182._4_4_;
              auVar183._8_4_ = auVar178._8_4_ * auVar182._8_4_;
              auVar183._12_4_ = auVar178._12_4_ * auVar182._12_4_;
              auVar202._0_4_ = auVar334._0_4_ * auVar181._0_4_;
              auVar202._4_4_ = auVar334._4_4_ * auVar181._4_4_;
              auVar202._8_4_ = auVar334._8_4_ * auVar181._8_4_;
              auVar202._12_4_ = auVar334._12_4_ * auVar181._12_4_;
              auVar95 = vsubps_avx(auVar202,auVar183);
              auVar181 = vshufps_avx(auVar95,auVar95,0xc9);
              auVar178 = vshufps_avx(auVar120,auVar120,0xc9);
              auVar203._0_4_ = auVar178._0_4_ * auVar181._0_4_;
              auVar203._4_4_ = auVar178._4_4_ * auVar181._4_4_;
              auVar203._8_4_ = auVar178._8_4_ * auVar181._8_4_;
              auVar203._12_4_ = auVar178._12_4_ * auVar181._12_4_;
              auVar181 = vshufps_avx(auVar95,auVar95,0xd2);
              auVar121._0_4_ = auVar120._0_4_ * auVar181._0_4_;
              auVar121._4_4_ = auVar120._4_4_ * auVar181._4_4_;
              auVar121._8_4_ = auVar120._8_4_ * auVar181._8_4_;
              auVar121._12_4_ = auVar120._12_4_ * auVar181._12_4_;
              auVar178 = vsubps_avx(auVar203,auVar121);
              auVar181 = vshufps_avx(auVar178,auVar178,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar245;
                uVar8 = vmovlps_avx(auVar181);
                *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                (ray->Ng).field_0.field_0.z = auVar178._0_4_;
                ray->u = fVar257;
                ray->v = 0.0;
                ray->primID = local_800._0_4_;
                ray->geomID = uVar84;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_8d0 = vmovlps_avx(auVar181);
                local_8c8 = auVar178._0_4_;
                local_8c4 = fVar257;
                local_8c0 = 0;
                local_8bc = local_800._0_4_;
                local_8b8 = uVar84;
                local_8b4 = context->user->instID[0];
                local_8b0 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar245;
                local_680._0_4_ = 0xffffffff;
                local_a18.valid = (int *)local_680;
                local_a18.geometryUserPtr = pGVar12->userPtr;
                local_a18.context = context->user;
                local_a18.hit = (RTCHitN *)&local_8d0;
                local_a18.N = 1;
                local_a18.ray = (RTCRayN *)ray;
                if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_009230ea:
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar290 = ZEXT1664(auVar290._0_16_);
                    auVar324 = ZEXT1664(auVar324._0_16_);
                    (*p_Var16)(&local_a18);
                    if (*local_a18.valid == 0) goto LAB_0092318a;
                  }
                  (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).components[0] =
                       *(float *)local_a18.hit;
                  (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_a18.hit + 4);
                  (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_a18.hit + 8);
                  *(float *)((long)local_a18.ray + 0x3c) = *(float *)(local_a18.hit + 0xc);
                  *(float *)((long)local_a18.ray + 0x40) = *(float *)(local_a18.hit + 0x10);
                  *(float *)((long)local_a18.ray + 0x44) = *(float *)(local_a18.hit + 0x14);
                  *(float *)((long)local_a18.ray + 0x48) = *(float *)(local_a18.hit + 0x18);
                  *(float *)((long)local_a18.ray + 0x4c) = *(float *)(local_a18.hit + 0x1c);
                  *(float *)((long)local_a18.ray + 0x50) = *(float *)(local_a18.hit + 0x20);
                }
                else {
                  auVar290 = ZEXT1664(auVar290._0_16_);
                  auVar324 = ZEXT1664(auVar158);
                  (*pGVar12->intersectionFilterN)(&local_a18);
                  if (*local_a18.valid != 0) goto LAB_009230ea;
LAB_0092318a:
                  (ray->super_RayK<1>).tfar = fVar254;
                }
              }
            }
          }
        }
LAB_00922fcb:
        fVar245 = (ray->super_RayK<1>).tfar;
        auVar108._4_4_ = fVar245;
        auVar108._0_4_ = fVar245;
        auVar108._8_4_ = fVar245;
        auVar108._12_4_ = fVar245;
        auVar108._16_4_ = fVar245;
        auVar108._20_4_ = fVar245;
        auVar108._24_4_ = fVar245;
        auVar108._28_4_ = fVar245;
        auVar101 = vcmpps_avx(_local_740,auVar108,2);
        auVar101 = vandps_avx(auVar101,local_360);
      }
      auVar134._0_4_ = (float)local_780._0_4_ + (float)local_720._0_4_;
      auVar134._4_4_ = (float)local_780._4_4_ + (float)local_720._4_4_;
      auVar134._8_4_ = fStack_778 + fStack_718;
      auVar134._12_4_ = fStack_774 + fStack_714;
      auVar134._16_4_ = fStack_770 + fStack_710;
      auVar134._20_4_ = fStack_76c + fStack_70c;
      auVar134._24_4_ = fStack_768 + fStack_708;
      auVar134._28_4_ = fStack_764 + fStack_704;
      auVar101 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
      fVar245 = (ray->super_RayK<1>).tfar;
      auVar169._4_4_ = fVar245;
      auVar169._0_4_ = fVar245;
      auVar169._8_4_ = fVar245;
      auVar169._12_4_ = fVar245;
      auVar169._16_4_ = fVar245;
      auVar169._20_4_ = fVar245;
      auVar169._24_4_ = fVar245;
      auVar169._28_4_ = fVar245;
      auVar102 = vcmpps_avx(auVar134,auVar169,2);
      _local_740 = vandps_avx(auVar102,local_760);
      auVar135._8_4_ = 3;
      auVar135._0_8_ = 0x300000003;
      auVar135._12_4_ = 3;
      auVar135._16_4_ = 3;
      auVar135._20_4_ = 3;
      auVar135._24_4_ = 3;
      auVar135._28_4_ = 3;
      auVar170._8_4_ = 2;
      auVar170._0_8_ = 0x200000002;
      auVar170._12_4_ = 2;
      auVar170._16_4_ = 2;
      auVar170._20_4_ = 2;
      auVar170._24_4_ = 2;
      auVar170._28_4_ = 2;
      auVar102 = vblendvps_avx(auVar170,auVar135,local_620);
      auVar181 = vpcmpgtd_avx(auVar102._16_16_,local_660._0_16_);
      auVar178 = vpshufd_avx(local_640._0_16_,0);
      auVar178 = vpcmpgtd_avx(auVar102._0_16_,auVar178);
      auVar171._16_16_ = auVar181;
      auVar171._0_16_ = auVar101._0_16_;
      local_760 = vblendps_avx(ZEXT1632(auVar178),auVar171,0xf0);
      auVar102 = vandnps_avx(local_760,_local_740);
      local_6a0 = _local_560;
      local_720._4_4_ = (float)local_780._4_4_ + (float)local_560._4_4_;
      local_720._0_4_ = (float)local_780._0_4_ + (float)local_560._0_4_;
      fStack_718 = fStack_778 + fStack_558;
      fStack_714 = fStack_774 + fStack_554;
      fStack_710 = fStack_770 + fStack_550;
      fStack_70c = fStack_76c + fStack_54c;
      fStack_708 = fStack_768 + fStack_548;
      fStack_704 = fStack_764 + fStack_544;
      auVar366 = ZEXT3264(_local_8a0);
      auVar348 = ZEXT3264(_local_920);
      fVar245 = (float)local_780._0_4_;
      fVar254 = (float)local_780._4_4_;
      fVar257 = fStack_778;
      fVar260 = fStack_774;
      fVar142 = fStack_770;
      fVar145 = fStack_76c;
      fVar148 = fStack_768;
      fVar195 = fStack_764;
      while( true ) {
        local_680 = auVar102;
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0x7f,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0xbf,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar102[0x1f]) break;
        auVar109._8_4_ = 0x7f800000;
        auVar109._0_8_ = 0x7f8000007f800000;
        auVar109._12_4_ = 0x7f800000;
        auVar109._16_4_ = 0x7f800000;
        auVar109._20_4_ = 0x7f800000;
        auVar109._24_4_ = 0x7f800000;
        auVar109._28_4_ = 0x7f800000;
        auVar101 = vblendvps_avx(auVar109,local_6a0,auVar102);
        auVar130 = vshufps_avx(auVar101,auVar101,0xb1);
        auVar130 = vminps_avx(auVar101,auVar130);
        auVar21 = vshufpd_avx(auVar130,auVar130,5);
        auVar130 = vminps_avx(auVar130,auVar21);
        auVar21 = vperm2f128_avx(auVar130,auVar130,1);
        auVar130 = vminps_avx(auVar130,auVar21);
        auVar101 = vcmpps_avx(auVar101,auVar130,0);
        auVar130 = auVar102 & auVar101;
        if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar130 >> 0x7f,0) != '\0') ||
              (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0xbf,0) != '\0') ||
            (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar130[0x1f] < '\0') {
          auVar102 = vandps_avx(auVar101,auVar102);
        }
        uVar80 = vmovmskps_avx(auVar102);
        uVar85 = 0;
        if (uVar80 != 0) {
          for (; (uVar80 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
          }
        }
        uVar82 = (ulong)uVar85;
        *(undefined4 *)(local_680 + uVar82 * 4) = 0;
        aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
        local_7c0 = aVar9.x;
        fStack_7bc = aVar9.y;
        fStack_7b8 = aVar9.z;
        aStack_7b4 = aVar9.field_3;
        auVar181 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
        fVar245 = local_1c0[uVar82];
        local_9a0 = *(float *)(local_540 + uVar82 * 4);
        auVar274 = ZEXT416((uint)local_9a0);
        if (auVar181._0_4_ < 0.0) {
          fStack_99c = 0.0;
          fStack_998 = 0.0;
          fStack_994 = 0.0;
          auVar290 = ZEXT1664(auVar290._0_16_);
          auVar324 = ZEXT1664(auVar324._0_16_);
          fVar254 = sqrtf(auVar181._0_4_);
          auVar274._4_4_ = fStack_99c;
          auVar274._0_4_ = local_9a0;
          auVar274._8_4_ = fStack_998;
          auVar274._12_4_ = fStack_994;
          auVar348 = ZEXT3264(_local_920);
          auVar366 = ZEXT3264(_local_8a0);
        }
        else {
          auVar181 = vsqrtss_avx(auVar181,auVar181);
          fVar254 = auVar181._0_4_;
        }
        auVar178 = vminps_avx(auVar17,_local_930);
        auVar181 = vmaxps_avx(auVar17,_local_930);
        auVar95 = vminps_avx(auVar19,_local_940);
        auVar158 = vminps_avx(auVar178,auVar95);
        auVar178 = vmaxps_avx(auVar19,_local_940);
        auVar95 = vmaxps_avx(auVar181,auVar178);
        auVar184._8_4_ = 0x7fffffff;
        auVar184._0_8_ = 0x7fffffff7fffffff;
        auVar184._12_4_ = 0x7fffffff;
        auVar181 = vandps_avx(auVar158,auVar184);
        auVar178 = vandps_avx(auVar95,auVar184);
        auVar181 = vmaxps_avx(auVar181,auVar178);
        auVar178 = vmovshdup_avx(auVar181);
        auVar178 = vmaxss_avx(auVar178,auVar181);
        auVar181 = vshufpd_avx(auVar181,auVar181,1);
        auVar181 = vmaxss_avx(auVar181,auVar178);
        local_9c0._0_4_ = auVar181._0_4_ * 1.9073486e-06;
        local_820._0_4_ = fVar254 * 1.9073486e-06;
        local_6e0._0_16_ = vshufps_avx(auVar95,auVar95,0xff);
        auVar181 = vinsertps_avx(auVar274,ZEXT416((uint)fVar245),0x10);
        auVar215 = ZEXT1664(auVar181);
        lVar87 = 5;
        do {
          do {
            auVar181 = auVar215._0_16_;
            bVar90 = lVar87 == 0;
            lVar87 = lVar87 + -1;
            if (bVar90) goto LAB_00923b41;
            auVar178 = vshufps_avx(auVar181,auVar181,0);
            auVar98._0_4_ = auVar178._0_4_ * local_7c0 + 0.0;
            auVar98._4_4_ = auVar178._4_4_ * fStack_7bc + 0.0;
            auVar98._8_4_ = auVar178._8_4_ * fStack_7b8 + 0.0;
            auVar98._12_4_ = auVar178._12_4_ * aStack_7b4.w + 0.0;
            auVar178 = vmovshdup_avx(auVar181);
            fVar145 = auVar178._0_4_;
            local_960._0_4_ = 1.0 - fVar145;
            fVar254 = fVar145 * fVar145;
            fVar257 = fVar145 * 3.0;
            fVar245 = fVar257 + -5.0;
            fVar260 = (float)local_960._0_4_ * (float)local_960._0_4_;
            auVar178 = ZEXT416((uint)(fVar145 * fVar145 * -(float)local_960._0_4_ * 0.5));
            auVar178 = vshufps_avx(auVar178,auVar178,0);
            auVar95 = ZEXT416((uint)((fVar260 * ((float)local_960._0_4_ * 3.0 + -5.0) + 2.0) * 0.5))
            ;
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar158 = ZEXT416((uint)((fVar254 * fVar245 + 2.0) * 0.5));
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            auVar117 = ZEXT416((uint)((float)local_960._0_4_ * (float)local_960._0_4_ * -fVar145 *
                                     0.5));
            auVar117 = vshufps_avx(auVar117,auVar117,0);
            auVar162._0_4_ =
                 auVar117._0_4_ * local_a90 +
                 auVar158._0_4_ * (float)local_930._0_4_ +
                 auVar95._0_4_ * local_aa0 + auVar178._0_4_ * (float)local_940._0_4_;
            auVar162._4_4_ =
                 auVar117._4_4_ * fStack_a8c +
                 auVar158._4_4_ * (float)local_930._4_4_ +
                 auVar95._4_4_ * fStack_a9c + auVar178._4_4_ * (float)local_940._4_4_;
            auVar162._8_4_ =
                 auVar117._8_4_ * fStack_a88 +
                 auVar158._8_4_ * fStack_928 +
                 auVar95._8_4_ * fStack_a98 + auVar178._8_4_ * fStack_938;
            auVar162._12_4_ =
                 auVar117._12_4_ * fStack_a84 +
                 auVar158._12_4_ * fStack_924 +
                 auVar95._12_4_ * fStack_a94 + auVar178._12_4_ * fStack_934;
            fVar142 = (float)local_960._0_4_ * -2.0;
            local_7e0._0_16_ = auVar162;
            auVar178 = vsubps_avx(auVar98,auVar162);
            _local_9e0 = auVar178;
            auVar178 = vdpps_avx(auVar178,auVar178,0x7f);
            local_9a0 = auVar178._0_4_;
            fStack_99c = auVar178._4_4_;
            fStack_998 = auVar178._8_4_;
            fStack_994 = auVar178._12_4_;
            if (local_9a0 < 0.0) {
              local_900._0_4_ = fVar254;
              local_960._0_16_ = ZEXT416((uint)local_960._0_4_);
              local_980._0_4_ = fVar257;
              local_840._0_4_ = fVar145 * 9.0;
              local_860._0_4_ = fVar245;
              local_880._0_4_ = fVar260;
              local_6c0._0_4_ = fVar142;
              fVar148 = sqrtf(local_9a0);
              fVar245 = (float)local_860._0_4_;
              fVar142 = (float)local_6c0._0_4_;
              fVar254 = (float)local_900._0_4_;
              fVar195 = (float)local_980._0_4_;
              fVar219 = (float)local_840._0_4_;
              fVar260 = (float)local_880._0_4_;
            }
            else {
              auVar178 = vsqrtss_avx(auVar178,auVar178);
              fVar148 = auVar178._0_4_;
              fVar195 = fVar257;
              fVar219 = fVar145 * 9.0;
            }
            auVar178 = ZEXT416((uint)((fVar254 + fVar145 * fVar142) * 0.5));
            auVar178 = vshufps_avx(auVar178,auVar178,0);
            auVar95 = ZEXT416((uint)((((float)local_960._0_4_ + (float)local_960._0_4_) *
                                      (fVar195 + 2.0) +
                                     (float)local_960._0_4_ * (float)local_960._0_4_ * -3.0) * 0.5))
            ;
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar158 = ZEXT416((uint)((fVar245 * (fVar145 + fVar145) + fVar145 * fVar195) * 0.5));
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            auVar117 = ZEXT416((uint)((fVar145 * ((float)local_960._0_4_ + (float)local_960._0_4_) -
                                      fVar260) * 0.5));
            auVar117 = vshufps_avx(auVar117,auVar117,0);
            auVar319._0_4_ =
                 local_a90 * auVar117._0_4_ +
                 (float)local_930._0_4_ * auVar158._0_4_ +
                 (float)local_940._0_4_ * auVar178._0_4_ + local_aa0 * auVar95._0_4_;
            auVar319._4_4_ =
                 fStack_a8c * auVar117._4_4_ +
                 (float)local_930._4_4_ * auVar158._4_4_ +
                 (float)local_940._4_4_ * auVar178._4_4_ + fStack_a9c * auVar95._4_4_;
            auVar319._8_4_ =
                 fStack_a88 * auVar117._8_4_ +
                 fStack_928 * auVar158._8_4_ +
                 fStack_938 * auVar178._8_4_ + fStack_a98 * auVar95._8_4_;
            auVar319._12_4_ =
                 fStack_a84 * auVar117._12_4_ +
                 fStack_924 * auVar158._12_4_ +
                 fStack_934 * auVar178._12_4_ + fStack_a94 * auVar95._12_4_;
            auVar324 = ZEXT1664(auVar319);
            auVar117 = vpermilps_avx(ZEXT416((uint)(fVar257 + -1.0)),0);
            auVar251 = vpermilps_avx(ZEXT416((uint)(fVar145 * -9.0 + 4.0)),0);
            auVar178 = vshufps_avx(ZEXT416((uint)(fVar219 + -5.0)),ZEXT416((uint)(fVar219 + -5.0)),0
                                  );
            auVar95 = ZEXT416((uint)(fVar145 * -3.0 + 2.0));
            auVar158 = vshufps_avx(auVar95,auVar95,0);
            auVar95 = vdpps_avx(auVar319,auVar319,0x7f);
            auVar122._0_4_ =
                 local_a90 * auVar158._0_4_ +
                 (float)local_930._0_4_ * auVar178._0_4_ +
                 local_aa0 * auVar251._0_4_ + (float)local_940._0_4_ * auVar117._0_4_;
            auVar122._4_4_ =
                 fStack_a8c * auVar158._4_4_ +
                 (float)local_930._4_4_ * auVar178._4_4_ +
                 fStack_a9c * auVar251._4_4_ + (float)local_940._4_4_ * auVar117._4_4_;
            auVar122._8_4_ =
                 fStack_a88 * auVar158._8_4_ +
                 fStack_928 * auVar178._8_4_ +
                 fStack_a98 * auVar251._8_4_ + fStack_938 * auVar117._8_4_;
            auVar122._12_4_ =
                 fStack_a84 * auVar158._12_4_ +
                 fStack_924 * auVar178._12_4_ +
                 fStack_a94 * auVar251._12_4_ + fStack_934 * auVar117._12_4_;
            auVar178 = vblendps_avx(auVar95,_DAT_01f45a50,0xe);
            auVar158 = vrsqrtss_avx(auVar178,auVar178);
            fVar254 = auVar158._0_4_;
            fVar245 = auVar95._0_4_;
            auVar158 = vdpps_avx(auVar319,auVar122,0x7f);
            auVar117 = vshufps_avx(auVar95,auVar95,0);
            auVar123._0_4_ = auVar122._0_4_ * auVar117._0_4_;
            auVar123._4_4_ = auVar122._4_4_ * auVar117._4_4_;
            auVar123._8_4_ = auVar122._8_4_ * auVar117._8_4_;
            auVar123._12_4_ = auVar122._12_4_ * auVar117._12_4_;
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            auVar204._0_4_ = auVar319._0_4_ * auVar158._0_4_;
            auVar204._4_4_ = auVar319._4_4_ * auVar158._4_4_;
            auVar204._8_4_ = auVar319._8_4_ * auVar158._8_4_;
            auVar204._12_4_ = auVar319._12_4_ * auVar158._12_4_;
            auVar251 = vsubps_avx(auVar123,auVar204);
            auVar158 = vrcpss_avx(auVar178,auVar178);
            auVar178 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                  ZEXT416((uint)(auVar215._0_4_ * (float)local_820._0_4_)));
            auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar245 * auVar158._0_4_)));
            auVar158 = vshufps_avx(auVar158,auVar158,0);
            uVar82 = CONCAT44(auVar319._4_4_,auVar319._0_4_);
            auVar284._0_8_ = uVar82 ^ 0x8000000080000000;
            auVar284._8_4_ = -auVar319._8_4_;
            auVar284._12_4_ = -auVar319._12_4_;
            auVar117 = ZEXT416((uint)(fVar254 * 1.5 + fVar245 * -0.5 * fVar254 * fVar254 * fVar254))
            ;
            auVar117 = vshufps_avx(auVar117,auVar117,0);
            auVar185._0_4_ = auVar117._0_4_ * auVar251._0_4_ * auVar158._0_4_;
            auVar185._4_4_ = auVar117._4_4_ * auVar251._4_4_ * auVar158._4_4_;
            auVar185._8_4_ = auVar117._8_4_ * auVar251._8_4_ * auVar158._8_4_;
            auVar185._12_4_ = auVar117._12_4_ * auVar251._12_4_ * auVar158._12_4_;
            local_960._0_4_ = auVar319._0_4_ * auVar117._0_4_;
            local_960._4_4_ = auVar319._4_4_ * auVar117._4_4_;
            local_960._8_4_ = auVar319._8_4_ * auVar117._8_4_;
            local_960._12_4_ = auVar319._12_4_ * auVar117._12_4_;
            if (fVar245 < 0.0) {
              local_900._0_16_ = auVar284;
              local_980._0_16_ = auVar185;
              auVar324 = ZEXT1664(auVar319);
              fVar245 = sqrtf(fVar245);
              auVar185 = local_980._0_16_;
              auVar284 = local_900._0_16_;
            }
            else {
              auVar95 = vsqrtss_avx(auVar95,auVar95);
              fVar245 = auVar95._0_4_;
            }
            auVar290 = ZEXT1664(auVar284);
            auVar275._4_4_ = fStack_99c;
            auVar275._0_4_ = local_9a0;
            auVar275._8_4_ = fStack_998;
            auVar275._12_4_ = fStack_994;
            auVar95 = vdpps_avx(_local_9e0,local_960._0_16_,0x7f);
            local_900._0_4_ =
                 ((float)local_9c0._0_4_ / fVar245) * (fVar148 + 1.0) +
                 fVar148 * (float)local_9c0._0_4_ + auVar178._0_4_;
            auVar158 = vdpps_avx(auVar284,local_960._0_16_,0x7f);
            auVar117 = vdpps_avx(_local_9e0,auVar185,0x7f);
            auVar76._4_4_ = fStack_7bc;
            auVar76._0_4_ = local_7c0;
            auVar76._8_4_ = fStack_7b8;
            auVar76._12_4_ = aStack_7b4.a;
            auVar251 = vdpps_avx(auVar76,local_960._0_16_,0x7f);
            auVar18 = vdpps_avx(_local_9e0,auVar284,0x7f);
            fVar245 = auVar158._0_4_ + auVar117._0_4_;
            fVar254 = auVar95._0_4_;
            auVar99._0_4_ = fVar254 * fVar254;
            auVar99._4_4_ = auVar95._4_4_ * auVar95._4_4_;
            auVar99._8_4_ = auVar95._8_4_ * auVar95._8_4_;
            auVar99._12_4_ = auVar95._12_4_ * auVar95._12_4_;
            auVar117 = vsubps_avx(auVar275,auVar99);
            local_960._0_16_ = ZEXT416((uint)fVar245);
            auVar158 = vdpps_avx(_local_9e0,auVar76,0x7f);
            fVar257 = auVar18._0_4_ - fVar254 * fVar245;
            fVar254 = auVar158._0_4_ - fVar254 * auVar251._0_4_;
            auVar158 = vrsqrtss_avx(auVar117,auVar117);
            fVar260 = auVar117._0_4_;
            fVar245 = auVar158._0_4_;
            fVar245 = fVar245 * 1.5 + fVar260 * -0.5 * fVar245 * fVar245 * fVar245;
            if (fVar260 < 0.0) {
              local_980._0_16_ = auVar251;
              local_840._0_4_ = fVar257;
              local_860._0_4_ = fVar254;
              local_880._0_4_ = fVar245;
              auVar290 = ZEXT1664(auVar284);
              auVar324 = ZEXT1664(auVar324._0_16_);
              fVar260 = sqrtf(fVar260);
              auVar275._4_4_ = fStack_99c;
              auVar275._0_4_ = local_9a0;
              auVar275._8_4_ = fStack_998;
              auVar275._12_4_ = fStack_994;
              fVar245 = (float)local_880._0_4_;
              fVar257 = (float)local_840._0_4_;
              fVar254 = (float)local_860._0_4_;
              auVar251 = local_980._0_16_;
            }
            else {
              auVar158 = vsqrtss_avx(auVar117,auVar117);
              fVar260 = auVar158._0_4_;
            }
            auVar366 = ZEXT3264(_local_8a0);
            auVar348 = ZEXT3264(_local_920);
            auVar18 = vpermilps_avx(local_7e0._0_16_,0xff);
            auVar20 = vshufps_avx(auVar319,auVar319,0xff);
            fVar257 = fVar257 * fVar245 - auVar20._0_4_;
            auVar205._0_8_ = auVar251._0_8_ ^ 0x8000000080000000;
            auVar205._8_4_ = auVar251._8_4_ ^ 0x80000000;
            auVar205._12_4_ = auVar251._12_4_ ^ 0x80000000;
            auVar226._0_4_ = -fVar257;
            auVar226._4_4_ = 0x80000000;
            auVar226._8_4_ = 0x80000000;
            auVar226._12_4_ = 0x80000000;
            auVar158 = vinsertps_avx(auVar226,ZEXT416((uint)(fVar254 * fVar245)),0x1c);
            auVar251 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar254 * fVar245 -
                                                   auVar251._0_4_ * fVar257)));
            auVar158 = vdivps_avx(auVar158,auVar251);
            auVar117 = vinsertps_avx(local_960._0_16_,auVar205,0x10);
            auVar117 = vdivps_avx(auVar117,auVar251);
            auVar251 = vmovsldup_avx(auVar95);
            auVar97 = ZEXT416((uint)(fVar260 - auVar18._0_4_));
            auVar18 = vmovsldup_avx(auVar97);
            auVar163._0_4_ = auVar251._0_4_ * auVar158._0_4_ + auVar18._0_4_ * auVar117._0_4_;
            auVar163._4_4_ = auVar251._4_4_ * auVar158._4_4_ + auVar18._4_4_ * auVar117._4_4_;
            auVar163._8_4_ = auVar251._8_4_ * auVar158._8_4_ + auVar18._8_4_ * auVar117._8_4_;
            auVar163._12_4_ = auVar251._12_4_ * auVar158._12_4_ + auVar18._12_4_ * auVar117._12_4_;
            auVar158 = vsubps_avx(auVar181,auVar163);
            auVar215 = ZEXT1664(auVar158);
            auVar164._8_4_ = 0x7fffffff;
            auVar164._0_8_ = 0x7fffffff7fffffff;
            auVar164._12_4_ = 0x7fffffff;
            auVar181 = vandps_avx(auVar95,auVar164);
          } while ((float)local_900._0_4_ <= auVar181._0_4_);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar181 = vandps_avx(auVar97,auVar186);
        } while ((float)local_6e0._0_4_ * 1.9073486e-06 + (float)local_900._0_4_ + auVar178._0_4_ <=
                 auVar181._0_4_);
        fVar245 = auVar158._0_4_ + (float)local_7a0._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar245) &&
           (fVar254 = (ray->super_RayK<1>).tfar, fVar245 <= fVar254)) {
          auVar181 = vmovshdup_avx(auVar158);
          fVar257 = auVar181._0_4_;
          if ((0.0 <= fVar257) && (fVar257 <= 1.0)) {
            auVar181 = vrsqrtss_avx(auVar275,auVar275);
            fVar260 = auVar181._0_4_;
            pGVar12 = (context->scene->geometries).items[uVar84].ptr;
            if ((pGVar12->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar181 = ZEXT416((uint)(fVar260 * 1.5 +
                                       auVar275._0_4_ * -0.5 * fVar260 * fVar260 * fVar260));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar187._0_4_ = auVar181._0_4_ * (float)local_9e0._0_4_;
              auVar187._4_4_ = auVar181._4_4_ * (float)local_9e0._4_4_;
              auVar187._8_4_ = auVar181._8_4_ * fStack_9d8;
              auVar187._12_4_ = auVar181._12_4_ * fStack_9d4;
              auVar124._0_4_ = auVar319._0_4_ + auVar20._0_4_ * auVar187._0_4_;
              auVar124._4_4_ = auVar319._4_4_ + auVar20._4_4_ * auVar187._4_4_;
              auVar124._8_4_ = auVar319._8_4_ + auVar20._8_4_ * auVar187._8_4_;
              auVar124._12_4_ = auVar319._12_4_ + auVar20._12_4_ * auVar187._12_4_;
              auVar181 = vshufps_avx(auVar187,auVar187,0xc9);
              auVar178 = vshufps_avx(auVar319,auVar319,0xc9);
              auVar188._0_4_ = auVar178._0_4_ * auVar187._0_4_;
              auVar188._4_4_ = auVar178._4_4_ * auVar187._4_4_;
              auVar188._8_4_ = auVar178._8_4_ * auVar187._8_4_;
              auVar188._12_4_ = auVar178._12_4_ * auVar187._12_4_;
              auVar206._0_4_ = auVar319._0_4_ * auVar181._0_4_;
              auVar206._4_4_ = auVar319._4_4_ * auVar181._4_4_;
              auVar206._8_4_ = auVar319._8_4_ * auVar181._8_4_;
              auVar206._12_4_ = auVar319._12_4_ * auVar181._12_4_;
              auVar95 = vsubps_avx(auVar206,auVar188);
              auVar181 = vshufps_avx(auVar95,auVar95,0xc9);
              auVar178 = vshufps_avx(auVar124,auVar124,0xc9);
              auVar207._0_4_ = auVar178._0_4_ * auVar181._0_4_;
              auVar207._4_4_ = auVar178._4_4_ * auVar181._4_4_;
              auVar207._8_4_ = auVar178._8_4_ * auVar181._8_4_;
              auVar207._12_4_ = auVar178._12_4_ * auVar181._12_4_;
              auVar181 = vshufps_avx(auVar95,auVar95,0xd2);
              auVar125._0_4_ = auVar124._0_4_ * auVar181._0_4_;
              auVar125._4_4_ = auVar124._4_4_ * auVar181._4_4_;
              auVar125._8_4_ = auVar124._8_4_ * auVar181._8_4_;
              auVar125._12_4_ = auVar124._12_4_ * auVar181._12_4_;
              auVar178 = vsubps_avx(auVar207,auVar125);
              auVar181 = vshufps_avx(auVar178,auVar178,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar245;
                uVar8 = vmovlps_avx(auVar181);
                *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                (ray->Ng).field_0.field_0.z = auVar178._0_4_;
                ray->u = fVar257;
                ray->v = 0.0;
                ray->primID = local_800._0_4_;
                ray->geomID = uVar84;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_8d0 = vmovlps_avx(auVar181);
                local_8c8 = auVar178._0_4_;
                local_8c4 = fVar257;
                local_8c0 = 0;
                local_8bc = local_800._0_4_;
                local_8b8 = uVar84;
                local_8b4 = context->user->instID[0];
                local_8b0 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar245;
                local_9e4 = -1;
                local_a18.valid = &local_9e4;
                local_a18.geometryUserPtr = pGVar12->userPtr;
                local_a18.context = context->user;
                local_a18.hit = (RTCHitN *)&local_8d0;
                local_a18.N = 1;
                local_a18.ray = (RTCRayN *)ray;
                if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00923c6f:
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar290 = ZEXT1664(auVar290._0_16_);
                    auVar324 = ZEXT1664(auVar324._0_16_);
                    (*p_Var16)(&local_a18);
                    auVar348 = ZEXT3264(_local_920);
                    auVar366 = ZEXT3264(_local_8a0);
                    if (*local_a18.valid == 0) goto LAB_00923d21;
                  }
                  (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).components[0] =
                       *(float *)local_a18.hit;
                  (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_a18.hit + 4);
                  (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_a18.hit + 8);
                  *(float *)((long)local_a18.ray + 0x3c) = *(float *)(local_a18.hit + 0xc);
                  *(float *)((long)local_a18.ray + 0x40) = *(float *)(local_a18.hit + 0x10);
                  *(float *)((long)local_a18.ray + 0x44) = *(float *)(local_a18.hit + 0x14);
                  *(float *)((long)local_a18.ray + 0x48) = *(float *)(local_a18.hit + 0x18);
                  *(float *)((long)local_a18.ray + 0x4c) = *(float *)(local_a18.hit + 0x1c);
                  *(float *)((long)local_a18.ray + 0x50) = *(float *)(local_a18.hit + 0x20);
                }
                else {
                  auVar290 = ZEXT1664(auVar290._0_16_);
                  auVar324 = ZEXT1664(auVar324._0_16_);
                  (*pGVar12->intersectionFilterN)(&local_a18);
                  auVar348 = ZEXT3264(_local_920);
                  auVar366 = ZEXT3264(_local_8a0);
                  if (*local_a18.valid != 0) goto LAB_00923c6f;
LAB_00923d21:
                  (ray->super_RayK<1>).tfar = fVar254;
                }
              }
            }
          }
        }
LAB_00923b41:
        fVar245 = (ray->super_RayK<1>).tfar;
        auVar136._4_4_ = fVar245;
        auVar136._0_4_ = fVar245;
        auVar136._8_4_ = fVar245;
        auVar136._12_4_ = fVar245;
        auVar136._16_4_ = fVar245;
        auVar136._20_4_ = fVar245;
        auVar136._24_4_ = fVar245;
        auVar136._28_4_ = fVar245;
        auVar101 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        auVar102 = vcmpps_avx(_local_720,auVar136,2);
        auVar102 = vandps_avx(auVar102,local_680);
        fVar245 = (float)local_780._0_4_;
        fVar254 = (float)local_780._4_4_;
        fVar257 = fStack_778;
        fVar260 = fStack_774;
        fVar142 = fStack_770;
        fVar145 = fStack_76c;
        fVar148 = fStack_768;
        fVar195 = fStack_764;
      }
      auVar102 = vandps_avx(local_600,_local_5e0);
      auVar130 = vandps_avx(local_760,_local_740);
      auVar212._0_4_ = fVar245 + local_520._0_4_;
      auVar212._4_4_ = fVar254 + local_520._4_4_;
      auVar212._8_4_ = fVar257 + local_520._8_4_;
      auVar212._12_4_ = fVar260 + local_520._12_4_;
      auVar212._16_4_ = fVar142 + local_520._16_4_;
      auVar212._20_4_ = fVar145 + local_520._20_4_;
      auVar212._24_4_ = fVar148 + local_520._24_4_;
      auVar212._28_4_ = fVar195 + local_520._28_4_;
      auVar181 = vshufps_avx(auVar101._0_16_,auVar101._0_16_,0);
      auVar234._16_16_ = auVar181;
      auVar234._0_16_ = auVar181;
      auVar101 = vcmpps_avx(auVar212,auVar234,2);
      auVar101 = vandps_avx(auVar101,auVar102);
      auVar213._0_4_ = fVar245 + local_560._0_4_;
      auVar213._4_4_ = fVar254 + local_560._4_4_;
      auVar213._8_4_ = fVar257 + local_560._8_4_;
      auVar213._12_4_ = fVar260 + local_560._12_4_;
      auVar213._16_4_ = fVar142 + local_560._16_4_;
      auVar213._20_4_ = fVar145 + local_560._20_4_;
      auVar213._24_4_ = fVar148 + local_560._24_4_;
      auVar213._28_4_ = fVar195 + local_560._28_4_;
      auVar102 = vcmpps_avx(auVar213,auVar234,2);
      auVar102 = vandps_avx(auVar102,auVar130);
      auVar102 = vorps_avx(auVar101,auVar102);
      if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0x7f,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0xbf,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar102[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar86 * 0x60) = auVar102;
        auVar101 = vblendvps_avx(_local_560,local_520,auVar101);
        *(undefined1 (*) [32])(auStack_160 + uVar86 * 0x60) = auVar101;
        uVar82 = vmovlps_avx(local_570);
        (&uStack_140)[uVar86 * 0xc] = uVar82;
        auStack_138[uVar86 * 0x18] = local_aec + 1;
        uVar86 = (ulong)((int)uVar86 + 1);
      }
    }
    fVar219 = (ray->super_RayK<1>).tfar;
    auVar166._4_4_ = fVar219;
    auVar166._0_4_ = fVar219;
    auVar166._8_4_ = fVar219;
    auVar166._12_4_ = fVar219;
    auVar166._16_4_ = fVar219;
    auVar166._20_4_ = fVar219;
    auVar166._24_4_ = fVar219;
    auVar166._28_4_ = fVar219;
    while( true ) {
      uVar85 = (uint)uVar86;
      if (uVar85 == 0) {
        auVar100 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
        auVar100 = vshufps_avx(auVar100,auVar100,0);
        auVar100 = vcmpps_avx(local_580,auVar100,2);
        uVar84 = vmovmskps_avx(auVar100);
        uVar81 = (ulong)((uint)uVar81 - 1 & (uint)uVar81 & uVar84);
        goto LAB_0092135a;
      }
      uVar82 = (ulong)(uVar85 - 1);
      lVar87 = uVar82 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_180 + lVar87);
      auVar215 = ZEXT3264(auVar101);
      auVar102 = *(undefined1 (*) [32])(auStack_160 + lVar87);
      auVar129._0_4_ = fVar245 + auVar102._0_4_;
      auVar129._4_4_ = fVar254 + auVar102._4_4_;
      auVar129._8_4_ = fVar257 + auVar102._8_4_;
      auVar129._12_4_ = fVar260 + auVar102._12_4_;
      auVar129._16_4_ = fVar142 + auVar102._16_4_;
      auVar129._20_4_ = fVar145 + auVar102._20_4_;
      auVar129._24_4_ = fVar148 + auVar102._24_4_;
      auVar129._28_4_ = fVar195 + auVar102._28_4_;
      auVar21 = vcmpps_avx(auVar129,auVar166,2);
      auVar130 = vandps_avx(auVar21,auVar101);
      local_520 = auVar130;
      auVar101 = auVar101 & auVar21;
      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0x7f,0) != '\0') ||
            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar101 >> 0xbf,0) != '\0') ||
          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar101[0x1f] < '\0') break;
      uVar86 = (ulong)(uVar85 - 1);
    }
    auVar105._8_4_ = 0x7f800000;
    auVar105._0_8_ = 0x7f8000007f800000;
    auVar105._12_4_ = 0x7f800000;
    auVar105._16_4_ = 0x7f800000;
    auVar105._20_4_ = 0x7f800000;
    auVar105._24_4_ = 0x7f800000;
    auVar105._28_4_ = 0x7f800000;
    auVar101 = vblendvps_avx(auVar105,auVar102,auVar130);
    auVar102 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar102 = vminps_avx(auVar101,auVar102);
    auVar21 = vshufpd_avx(auVar102,auVar102,5);
    auVar102 = vminps_avx(auVar102,auVar21);
    auVar21 = vperm2f128_avx(auVar102,auVar102,1);
    auVar102 = vminps_avx(auVar102,auVar21);
    auVar101 = vcmpps_avx(auVar101,auVar102,0);
    auVar102 = auVar130 & auVar101;
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0x7f,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar102 >> 0xbf,0) != '\0') ||
        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar102[0x1f] < '\0') {
      auVar130 = vandps_avx(auVar101,auVar130);
    }
    auVar93._8_8_ = 0;
    auVar93._0_8_ = (&uStack_140)[uVar82 * 0xc];
    local_aec = auStack_138[uVar82 * 0x18];
    uVar83 = vmovmskps_avx(auVar130);
    uVar80 = 0;
    if (uVar83 != 0) {
      for (; (uVar83 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
      }
    }
    *(undefined4 *)(local_520 + (ulong)uVar80 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar87) = local_520;
    uVar83 = uVar85 - 1;
    if ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_520 >> 0x7f,0) != '\0') ||
          (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_520 >> 0xbf,0) != '\0') ||
        (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_520[0x1f] < '\0') {
      uVar83 = uVar85;
    }
    auVar181 = vshufps_avx(auVar93,auVar93,0);
    auVar178 = vshufps_avx(auVar93,auVar93,0x55);
    auVar178 = vsubps_avx(auVar178,auVar181);
    local_560._4_4_ = auVar181._4_4_ + auVar178._4_4_ * 0.14285715;
    local_560._0_4_ = auVar181._0_4_ + auVar178._0_4_ * 0.0;
    fStack_558 = auVar181._8_4_ + auVar178._8_4_ * 0.2857143;
    fStack_554 = auVar181._12_4_ + auVar178._12_4_ * 0.42857146;
    fStack_550 = auVar181._0_4_ + auVar178._0_4_ * 0.5714286;
    fStack_54c = auVar181._4_4_ + auVar178._4_4_ * 0.71428573;
    fStack_548 = auVar181._8_4_ + auVar178._8_4_ * 0.8571429;
    fStack_544 = auVar181._12_4_ + auVar178._12_4_;
    local_570._8_8_ = 0;
    local_570._0_8_ = *(ulong *)(local_560 + (ulong)uVar80 * 4);
    uVar86 = (ulong)uVar83;
    uVar82 = local_800._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }